

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar45 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  int iVar90;
  float fVar91;
  vint4 bi_2;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  undefined4 uVar95;
  float fVar106;
  vint4 bi_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  vint4 bi;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  vint4 ai_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar140;
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar141;
  float fVar152;
  vint4 ai_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  vfloat4 a0_3;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  __m128 a_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  float fVar183;
  float fVar197;
  float fVar198;
  __m128 a;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar199;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar208;
  float fVar216;
  float fVar217;
  vfloat4 a0_1;
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  float fVar227;
  float fVar228;
  vfloat4 a0;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar229;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  int iVar241;
  undefined1 in_ZMM29 [64];
  undefined1 auVar242 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_388;
  undefined8 uStack_380;
  RayQueryContext *local_370;
  RTCFilterFunctionNArguments local_368;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  uint auStack_2e8 [4];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint uStack_148;
  float afStack_144 [7];
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar25;
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  
  PVar3 = prim[1];
  uVar31 = (ulong)(byte)PVar3;
  fVar91 = *(float *)(prim + uVar31 * 0x19 + 0x12);
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar32 = vsubps_avx(auVar32,*(undefined1 (*) [16])(prim + uVar31 * 0x19 + 6));
  auVar46._0_4_ = fVar91 * auVar32._0_4_;
  auVar46._4_4_ = fVar91 * auVar32._4_4_;
  auVar46._8_4_ = fVar91 * auVar32._8_4_;
  auVar46._12_4_ = fVar91 * auVar32._12_4_;
  auVar43._0_4_ = fVar91 * auVar33._0_4_;
  auVar43._4_4_ = fVar91 * auVar33._4_4_;
  auVar43._8_4_ = fVar91 * auVar33._8_4_;
  auVar43._12_4_ = fVar91 * auVar33._12_4_;
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 4 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 5 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 6 + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 0xb + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar31 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  uVar30 = (ulong)(uint)((int)(uVar31 * 9) * 2);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 + uVar31 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  uVar24 = (ulong)(uint)((int)(uVar31 * 5) << 2);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar56._4_4_ = auVar43._0_4_;
  auVar56._0_4_ = auVar43._0_4_;
  auVar56._8_4_ = auVar43._0_4_;
  auVar56._12_4_ = auVar43._0_4_;
  auVar39 = vshufps_avx(auVar43,auVar43,0x55);
  auVar35 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar91 = auVar35._0_4_;
  auVar55._0_4_ = fVar91 * auVar34._0_4_;
  fVar201 = auVar35._4_4_;
  auVar55._4_4_ = fVar201 * auVar34._4_4_;
  fVar183 = auVar35._8_4_;
  auVar55._8_4_ = fVar183 * auVar34._8_4_;
  fVar197 = auVar35._12_4_;
  auVar55._12_4_ = fVar197 * auVar34._12_4_;
  auVar53._0_4_ = auVar40._0_4_ * fVar91;
  auVar53._4_4_ = auVar40._4_4_ * fVar201;
  auVar53._8_4_ = auVar40._8_4_ * fVar183;
  auVar53._12_4_ = auVar40._12_4_ * fVar197;
  auVar52._0_4_ = auVar38._0_4_ * fVar91;
  auVar52._4_4_ = auVar38._4_4_ * fVar201;
  auVar52._8_4_ = auVar38._8_4_ * fVar183;
  auVar52._12_4_ = auVar38._12_4_ * fVar197;
  auVar35 = vfmadd231ps_fma(auVar55,auVar39,auVar33);
  auVar41 = vfmadd231ps_fma(auVar53,auVar39,auVar44);
  auVar39 = vfmadd231ps_fma(auVar52,auVar36,auVar39);
  auVar42 = vfmadd231ps_fma(auVar35,auVar56,auVar32);
  auVar41 = vfmadd231ps_fma(auVar41,auVar56,auVar14);
  auVar43 = vfmadd231ps_fma(auVar39,auVar37,auVar56);
  auVar220._4_4_ = auVar46._0_4_;
  auVar220._0_4_ = auVar46._0_4_;
  auVar220._8_4_ = auVar46._0_4_;
  auVar220._12_4_ = auVar46._0_4_;
  auVar39 = vshufps_avx(auVar46,auVar46,0x55);
  auVar35 = vshufps_avx(auVar46,auVar46,0xaa);
  fVar91 = auVar35._0_4_;
  auVar235._0_4_ = fVar91 * auVar34._0_4_;
  fVar201 = auVar35._4_4_;
  auVar235._4_4_ = fVar201 * auVar34._4_4_;
  fVar183 = auVar35._8_4_;
  auVar235._8_4_ = fVar183 * auVar34._8_4_;
  fVar197 = auVar35._12_4_;
  auVar235._12_4_ = fVar197 * auVar34._12_4_;
  auVar48._0_4_ = auVar40._0_4_ * fVar91;
  auVar48._4_4_ = auVar40._4_4_ * fVar201;
  auVar48._8_4_ = auVar40._8_4_ * fVar183;
  auVar48._12_4_ = auVar40._12_4_ * fVar197;
  auVar47._0_4_ = auVar38._0_4_ * fVar91;
  auVar47._4_4_ = auVar38._4_4_ * fVar201;
  auVar47._8_4_ = auVar38._8_4_ * fVar183;
  auVar47._12_4_ = auVar38._12_4_ * fVar197;
  auVar33 = vfmadd231ps_fma(auVar235,auVar39,auVar33);
  auVar34 = vfmadd231ps_fma(auVar48,auVar39,auVar44);
  auVar44 = vfmadd231ps_fma(auVar47,auVar39,auVar36);
  auVar40 = vfmadd231ps_fma(auVar33,auVar220,auVar32);
  auVar36 = vfmadd231ps_fma(auVar34,auVar220,auVar14);
  auVar71._16_16_ = in_YmmResult._16_16_;
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar32);
  auVar38 = vfmadd231ps_fma(auVar44,auVar220,auVar37);
  auVar33 = vandps_avx512vl(auVar42,auVar32);
  auVar50._8_4_ = 0x219392ef;
  auVar50._0_8_ = 0x219392ef219392ef;
  auVar50._12_4_ = 0x219392ef;
  uVar30 = vcmpps_avx512vl(auVar33,auVar50,1);
  bVar10 = (bool)((byte)uVar30 & 1);
  auVar35._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._0_4_;
  bVar10 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._4_4_;
  bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._8_4_;
  bVar10 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._12_4_;
  auVar33 = vandps_avx512vl(auVar41,auVar32);
  uVar30 = vcmpps_avx512vl(auVar33,auVar50,1);
  bVar10 = (bool)((byte)uVar30 & 1);
  auVar42._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._0_4_;
  bVar10 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._4_4_;
  bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._8_4_;
  bVar10 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._12_4_;
  auVar32 = vandps_avx512vl(auVar43,auVar32);
  uVar30 = vcmpps_avx512vl(auVar32,auVar50,1);
  bVar10 = (bool)((byte)uVar30 & 1);
  auVar41._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._0_4_;
  bVar10 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._4_4_;
  bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._8_4_;
  bVar10 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._12_4_;
  auVar32 = vrcp14ps_avx512vl(auVar35);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar240 = ZEXT1664(auVar33);
  auVar34 = vfnmadd213ps_avx512vl(auVar35,auVar32,auVar33);
  auVar14 = vfmadd132ps_fma(auVar34,auVar32,auVar32);
  auVar32 = vrcp14ps_avx512vl(auVar42);
  auVar34 = vfnmadd213ps_avx512vl(auVar42,auVar32,auVar33);
  auVar44 = vfmadd132ps_fma(auVar34,auVar32,auVar32);
  auVar32 = vrcp14ps_avx512vl(auVar41);
  auVar33 = vfnmadd213ps_avx512vl(auVar41,auVar32,auVar33);
  auVar37 = vfmadd132ps_fma(auVar33,auVar32,auVar32);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar31 * 7 + 6);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar32 = vsubps_avx(auVar32,auVar40);
  auVar49._0_4_ = auVar14._0_4_ * auVar32._0_4_;
  auVar49._4_4_ = auVar14._4_4_ * auVar32._4_4_;
  auVar49._8_4_ = auVar14._8_4_ * auVar32._8_4_;
  auVar49._12_4_ = auVar14._12_4_ * auVar32._12_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar31 * 9 + 6);
  auVar32 = vpmovsxwd_avx(auVar33);
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar32 = vsubps_avx(auVar32,auVar40);
  auVar35 = vpbroadcastd_avx512vl();
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar33 = vpmovsxwd_avx(auVar34);
  auVar51._0_4_ = auVar14._0_4_ * auVar32._0_4_;
  auVar51._4_4_ = auVar14._4_4_ * auVar32._4_4_;
  auVar51._8_4_ = auVar14._8_4_ * auVar32._8_4_;
  auVar51._12_4_ = auVar14._12_4_ * auVar32._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar31 * -2 + 6);
  auVar32 = vpmovsxwd_avx(auVar14);
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar32 = vsubps_avx(auVar32,auVar36);
  auVar142._0_4_ = auVar44._0_4_ * auVar32._0_4_;
  auVar142._4_4_ = auVar44._4_4_ * auVar32._4_4_;
  auVar142._8_4_ = auVar44._8_4_ * auVar32._8_4_;
  auVar142._12_4_ = auVar44._12_4_ * auVar32._12_4_;
  auVar32 = vcvtdq2ps_avx(auVar33);
  auVar32 = vsubps_avx(auVar32,auVar36);
  auVar54._0_4_ = auVar44._0_4_ * auVar32._0_4_;
  auVar54._4_4_ = auVar44._4_4_ * auVar32._4_4_;
  auVar54._8_4_ = auVar44._8_4_ * auVar32._8_4_;
  auVar54._12_4_ = auVar44._12_4_ * auVar32._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar24 + uVar31 + 6);
  auVar32 = vpmovsxwd_avx(auVar44);
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar32 = vsubps_avx(auVar32,auVar38);
  auVar57._0_4_ = auVar37._0_4_ * auVar32._0_4_;
  auVar57._4_4_ = auVar37._4_4_ * auVar32._4_4_;
  auVar57._8_4_ = auVar37._8_4_ * auVar32._8_4_;
  auVar57._12_4_ = auVar37._12_4_ * auVar32._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar31 * 0x17 + 6);
  auVar32 = vpmovsxwd_avx(auVar40);
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar32 = vsubps_avx(auVar32,auVar38);
  auVar45._0_4_ = auVar37._0_4_ * auVar32._0_4_;
  auVar45._4_4_ = auVar37._4_4_ * auVar32._4_4_;
  auVar45._8_4_ = auVar37._8_4_ * auVar32._8_4_;
  auVar45._12_4_ = auVar37._12_4_ * auVar32._12_4_;
  auVar32 = vpminsd_avx(auVar49,auVar51);
  auVar33 = vpminsd_avx(auVar142,auVar54);
  auVar32 = vmaxps_avx(auVar32,auVar33);
  auVar33 = vpminsd_avx(auVar57,auVar45);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar37._4_4_ = uVar95;
  auVar37._0_4_ = uVar95;
  auVar37._8_4_ = uVar95;
  auVar37._12_4_ = uVar95;
  auVar33 = vmaxps_avx512vl(auVar33,auVar37);
  auVar32 = vmaxps_avx(auVar32,auVar33);
  auVar36._8_4_ = 0x3f7ffffa;
  auVar36._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar36._12_4_ = 0x3f7ffffa;
  local_2a8 = vmulps_avx512vl(auVar32,auVar36);
  auVar32 = vpmaxsd_avx(auVar49,auVar51);
  auVar33 = vpmaxsd_avx(auVar142,auVar54);
  auVar32 = vminps_avx(auVar32,auVar33);
  auVar33 = vpmaxsd_avx(auVar57,auVar45);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar38._4_4_ = uVar95;
  auVar38._0_4_ = uVar95;
  auVar38._8_4_ = uVar95;
  auVar38._12_4_ = uVar95;
  auVar33 = vminps_avx512vl(auVar33,auVar38);
  auVar32 = vminps_avx(auVar32,auVar33);
  auVar39._8_4_ = 0x3f800003;
  auVar39._0_8_ = 0x3f8000033f800003;
  auVar39._12_4_ = 0x3f800003;
  auVar32 = vmulps_avx512vl(auVar32,auVar39);
  uVar15 = vcmpps_avx512vl(local_2a8,auVar32,2);
  uVar30 = vpcmpgtd_avx512vl(auVar35,_DAT_01ff0cf0);
  uVar30 = ((byte)uVar15 & 0xf) & uVar30;
  if ((char)uVar30 == '\0') {
    return;
  }
  local_2d8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar236 = ZEXT1664(auVar32);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar237 = ZEXT1664(auVar32);
  auVar32 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar242 = ZEXT1664(auVar32);
LAB_01b3acb7:
  lVar28 = 0;
  for (uVar24 = uVar30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar29 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar28 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar29].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)uVar4 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar32 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar24);
  lVar28 = uVar24 + 1;
  auVar33 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar28);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar34 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar24);
  auVar14 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar28);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar91 = *(float *)(ray + k * 4 + 0x30);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar37 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar24),
                       auVar32,auVar36);
  auVar38 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar28),
                       auVar33,auVar36);
  auVar39 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar24 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar34,auVar36);
  auVar35 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar28),
                       auVar14,auVar36);
  auVar65._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar40 = vmulps_avx512vl(auVar33,auVar65._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar65._0_16_);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar37,auVar41);
  auVar107._0_4_ = auVar32._0_4_ + auVar40._0_4_;
  auVar107._4_4_ = auVar32._4_4_ + auVar40._4_4_;
  auVar107._8_4_ = auVar32._8_4_ + auVar40._8_4_;
  auVar107._12_4_ = auVar32._12_4_ + auVar40._12_4_;
  auVar52 = auVar236._0_16_;
  auVar40 = vfmadd231ps_avx512vl(auVar41,auVar37,auVar52);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar32,auVar52);
  auVar40 = vmulps_avx512vl(auVar14,auVar65._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar40,auVar35,auVar65._0_16_);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar42);
  auVar221._0_4_ = auVar34._0_4_ + auVar40._0_4_;
  auVar221._4_4_ = auVar34._4_4_ + auVar40._4_4_;
  auVar221._8_4_ = auVar34._8_4_ + auVar40._8_4_;
  auVar221._12_4_ = auVar34._12_4_ + auVar40._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar42,auVar39,auVar52);
  auVar42 = vfnmadd231ps_avx512vl(auVar40,auVar34,auVar52);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar38,auVar33);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar37,auVar65._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar40,auVar32,auVar65._0_16_);
  auVar33 = vmulps_avx512vl(auVar33,auVar52);
  auVar33 = vfnmadd231ps_avx512vl(auVar33,auVar52,auVar38);
  auVar33 = vfmadd231ps_avx512vl(auVar33,auVar65._0_16_,auVar37);
  auVar38 = vfnmadd231ps_avx512vl(auVar33,auVar65._0_16_,auVar32);
  auVar32 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar35,auVar14);
  auVar32 = vfmadd231ps_avx512vl(auVar32,auVar39,auVar65._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar32,auVar34,auVar65._0_16_);
  auVar32 = vmulps_avx512vl(auVar14,auVar52);
  auVar32 = vfnmadd231ps_avx512vl(auVar32,auVar52,auVar35);
  auVar32 = vfmadd231ps_avx512vl(auVar32,auVar65._0_16_,auVar39);
  auVar37 = vfnmadd231ps_avx512vl(auVar32,auVar65._0_16_,auVar34);
  auVar32 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar33 = vshufps_avx(auVar221,auVar221,0xc9);
  fVar94 = auVar41._0_4_;
  auVar153._0_4_ = fVar94 * auVar33._0_4_;
  fVar106 = auVar41._4_4_;
  auVar153._4_4_ = fVar106 * auVar33._4_4_;
  fVar199 = auVar41._8_4_;
  auVar153._8_4_ = fVar199 * auVar33._8_4_;
  fVar200 = auVar41._12_4_;
  auVar153._12_4_ = fVar200 * auVar33._12_4_;
  auVar33 = vfmsub231ps_fma(auVar153,auVar32,auVar221);
  auVar34 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar175._0_4_ = auVar33._0_4_ * fVar94;
  auVar175._4_4_ = auVar33._4_4_ * fVar106;
  auVar175._8_4_ = auVar33._8_4_ * fVar199;
  auVar175._12_4_ = auVar33._12_4_ * fVar200;
  auVar32 = vfmsub231ps_fma(auVar175,auVar32,auVar42);
  auVar14 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar32 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar33 = vshufps_avx(auVar40,auVar40,0xc9);
  fVar201 = auVar38._0_4_;
  auVar184._0_4_ = auVar33._0_4_ * fVar201;
  fVar183 = auVar38._4_4_;
  auVar184._4_4_ = auVar33._4_4_ * fVar183;
  fVar197 = auVar38._8_4_;
  auVar184._8_4_ = auVar33._8_4_ * fVar197;
  fVar198 = auVar38._12_4_;
  auVar184._12_4_ = auVar33._12_4_ * fVar198;
  auVar33 = vfmsub231ps_fma(auVar184,auVar32,auVar40);
  auVar40 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar185._0_4_ = auVar33._0_4_ * fVar201;
  auVar185._4_4_ = auVar33._4_4_ * fVar183;
  auVar185._8_4_ = auVar33._8_4_ * fVar197;
  auVar185._12_4_ = auVar33._12_4_ * fVar198;
  auVar32 = vfmsub231ps_fma(auVar185,auVar32,auVar37);
  auVar37 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar32 = vdpps_avx(auVar34,auVar34,0x7f);
  fVar132 = auVar32._0_4_;
  auVar65._16_16_ = auVar71._16_16_;
  auVar73._4_28_ = auVar65._4_28_;
  auVar73._0_4_ = fVar132;
  auVar33 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar73._0_16_);
  fVar140 = auVar33._0_4_;
  auVar33 = vmulss_avx512f(auVar32,ZEXT416(0x3f000000));
  fVar141 = fVar140 * 1.5 - auVar33._0_4_ * fVar140 * fVar140 * fVar140;
  auVar33 = vdpps_avx(auVar34,auVar14,0x7f);
  fVar219 = fVar141 * auVar34._0_4_;
  fVar227 = fVar141 * auVar34._4_4_;
  fVar228 = fVar141 * auVar34._8_4_;
  fVar229 = fVar141 * auVar34._12_4_;
  auVar176._0_4_ = fVar132 * auVar14._0_4_;
  auVar176._4_4_ = fVar132 * auVar14._4_4_;
  auVar176._8_4_ = fVar132 * auVar14._8_4_;
  auVar176._12_4_ = fVar132 * auVar14._12_4_;
  fVar132 = auVar33._0_4_;
  auVar154._0_4_ = fVar132 * auVar34._0_4_;
  auVar154._4_4_ = fVar132 * auVar34._4_4_;
  auVar154._8_4_ = fVar132 * auVar34._8_4_;
  auVar154._12_4_ = fVar132 * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar176,auVar154);
  auVar33 = vrcp14ss_avx512f(auVar65._0_16_,auVar73._0_16_);
  auVar32 = vfnmadd213ss_avx512f(auVar32,auVar33,ZEXT416(0x40000000));
  fVar132 = auVar33._0_4_ * auVar32._0_4_;
  auVar32 = vdpps_avx(auVar40,auVar40,0x7f);
  fVar140 = auVar32._0_4_;
  auVar58._16_16_ = auVar71._16_16_;
  auVar58._0_16_ = auVar65._0_16_;
  auVar74._4_28_ = auVar58._4_28_;
  auVar74._0_4_ = fVar140;
  auVar33 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar74._0_16_);
  fVar152 = auVar33._0_4_;
  auVar33 = vmulss_avx512f(auVar32,ZEXT416(0x3f000000));
  fVar152 = fVar152 * 1.5 - auVar33._0_4_ * fVar152 * fVar152 * fVar152;
  auVar33 = vdpps_avx(auVar40,auVar37,0x7f);
  fVar208 = fVar152 * auVar40._0_4_;
  fVar216 = fVar152 * auVar40._4_4_;
  fVar217 = fVar152 * auVar40._8_4_;
  fVar218 = fVar152 * auVar40._12_4_;
  auVar143._0_4_ = fVar140 * auVar37._0_4_;
  auVar143._4_4_ = fVar140 * auVar37._4_4_;
  auVar143._8_4_ = fVar140 * auVar37._8_4_;
  auVar143._12_4_ = fVar140 * auVar37._12_4_;
  fVar140 = auVar33._0_4_;
  auVar133._0_4_ = fVar140 * auVar40._0_4_;
  auVar133._4_4_ = fVar140 * auVar40._4_4_;
  auVar133._8_4_ = fVar140 * auVar40._8_4_;
  auVar133._12_4_ = fVar140 * auVar40._12_4_;
  auVar14 = vsubps_avx(auVar143,auVar133);
  auVar33 = vrcp14ss_avx512f(auVar65._0_16_,auVar74._0_16_);
  auVar32 = vfnmadd213ss_avx512f(auVar32,auVar33,ZEXT416(0x40000000));
  fVar140 = auVar32._0_4_ * auVar33._0_4_;
  auVar32 = vshufps_avx(auVar107,auVar107,0xff);
  auVar164._0_4_ = fVar219 * auVar32._0_4_;
  auVar164._4_4_ = fVar227 * auVar32._4_4_;
  auVar164._8_4_ = fVar228 * auVar32._8_4_;
  auVar164._12_4_ = fVar229 * auVar32._12_4_;
  local_1e8 = vsubps_avx(auVar107,auVar164);
  auVar33 = vshufps_avx(auVar41,auVar41,0xff);
  auVar144._0_4_ = auVar33._0_4_ * fVar219 + auVar32._0_4_ * fVar141 * fVar132 * auVar34._0_4_;
  auVar144._4_4_ = auVar33._4_4_ * fVar227 + auVar32._4_4_ * fVar141 * fVar132 * auVar34._4_4_;
  auVar144._8_4_ = auVar33._8_4_ * fVar228 + auVar32._8_4_ * fVar141 * fVar132 * auVar34._8_4_;
  auVar144._12_4_ = auVar33._12_4_ * fVar229 + auVar32._12_4_ * fVar141 * fVar132 * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar41,auVar144);
  local_1f8._0_4_ = auVar164._0_4_ + auVar107._0_4_;
  local_1f8._4_4_ = auVar164._4_4_ + auVar107._4_4_;
  fStack_1f0 = auVar164._8_4_ + auVar107._8_4_;
  fStack_1ec = auVar164._12_4_ + auVar107._12_4_;
  auVar96._0_4_ = fVar94 + auVar144._0_4_;
  auVar96._4_4_ = fVar106 + auVar144._4_4_;
  auVar96._8_4_ = fVar199 + auVar144._8_4_;
  auVar96._12_4_ = fVar200 + auVar144._12_4_;
  auVar32 = vshufps_avx(auVar43,auVar43,0xff);
  auVar145._0_4_ = fVar208 * auVar32._0_4_;
  auVar145._4_4_ = fVar216 * auVar32._4_4_;
  auVar145._8_4_ = fVar217 * auVar32._8_4_;
  auVar145._12_4_ = fVar218 * auVar32._12_4_;
  local_208 = vsubps_avx(auVar43,auVar145);
  auVar33 = vshufps_avx(auVar38,auVar38,0xff);
  auVar108._0_4_ = auVar33._0_4_ * fVar208 + auVar32._0_4_ * fVar152 * auVar14._0_4_ * fVar140;
  auVar108._4_4_ = auVar33._4_4_ * fVar216 + auVar32._4_4_ * fVar152 * auVar14._4_4_ * fVar140;
  auVar108._8_4_ = auVar33._8_4_ * fVar217 + auVar32._8_4_ * fVar152 * auVar14._8_4_ * fVar140;
  auVar108._12_4_ = auVar33._12_4_ * fVar218 + auVar32._12_4_ * fVar152 * auVar14._12_4_ * fVar140;
  auVar32 = vsubps_avx(auVar38,auVar108);
  _local_218 = vaddps_avx512vl(auVar43,auVar145);
  auVar109._0_4_ = fVar201 + auVar108._0_4_;
  auVar109._4_4_ = fVar183 + auVar108._4_4_;
  auVar109._8_4_ = fVar197 + auVar108._8_4_;
  auVar109._12_4_ = fVar198 + auVar108._12_4_;
  auVar33 = vmulps_avx512vl(auVar34,auVar36);
  local_228 = vaddps_avx512vl(local_1e8,auVar33);
  auVar32 = vmulps_avx512vl(auVar32,auVar36);
  local_238 = vsubps_avx512vl(local_208,auVar32);
  auVar32 = vmulps_avx512vl(auVar96,auVar36);
  _local_248 = vaddps_avx512vl(_local_1f8,auVar32);
  auVar32 = vmulps_avx512vl(auVar109,auVar36);
  _local_258 = vsubps_avx512vl(_local_218,auVar32);
  local_168 = vsubps_avx(local_1e8,auVar44);
  uVar95 = local_168._0_4_;
  auVar110._4_4_ = uVar95;
  auVar110._0_4_ = uVar95;
  auVar110._8_4_ = uVar95;
  auVar110._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_168,local_168,0x55);
  auVar33 = vshufps_avx(local_168,local_168,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar201 = pre->ray_space[k].vz.field_0.m128[0];
  fVar183 = pre->ray_space[k].vz.field_0.m128[1];
  fVar197 = pre->ray_space[k].vz.field_0.m128[2];
  fVar198 = pre->ray_space[k].vz.field_0.m128[3];
  auVar97._0_4_ = fVar201 * auVar33._0_4_;
  auVar97._4_4_ = fVar183 * auVar33._4_4_;
  auVar97._8_4_ = fVar197 * auVar33._8_4_;
  auVar97._12_4_ = fVar198 * auVar33._12_4_;
  auVar32 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar2,auVar32);
  auVar37 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar110);
  local_178 = vsubps_avx512vl(local_228,auVar44);
  uVar95 = local_178._0_4_;
  auVar116._4_4_ = uVar95;
  auVar116._0_4_ = uVar95;
  auVar116._8_4_ = uVar95;
  auVar116._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_178,local_178,0x55);
  auVar33 = vshufps_avx(local_178,local_178,0xaa);
  auVar111._0_4_ = fVar201 * auVar33._0_4_;
  auVar111._4_4_ = fVar183 * auVar33._4_4_;
  auVar111._8_4_ = fVar197 * auVar33._8_4_;
  auVar111._12_4_ = fVar198 * auVar33._12_4_;
  auVar32 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar2,auVar32);
  auVar36 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar116);
  local_188 = vsubps_avx512vl(local_238,auVar44);
  uVar95 = local_188._0_4_;
  auVar146._4_4_ = uVar95;
  auVar146._0_4_ = uVar95;
  auVar146._8_4_ = uVar95;
  auVar146._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_188,local_188,0x55);
  auVar33 = vshufps_avx(local_188,local_188,0xaa);
  auVar117._0_4_ = fVar201 * auVar33._0_4_;
  auVar117._4_4_ = fVar183 * auVar33._4_4_;
  auVar117._8_4_ = fVar197 * auVar33._8_4_;
  auVar117._12_4_ = fVar198 * auVar33._12_4_;
  auVar32 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar2,auVar32);
  auVar38 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar146);
  local_198 = vsubps_avx(local_208,auVar44);
  uVar95 = local_198._0_4_;
  auVar165._4_4_ = uVar95;
  auVar165._0_4_ = uVar95;
  auVar165._8_4_ = uVar95;
  auVar165._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_198,local_198,0x55);
  auVar33 = vshufps_avx(local_198,local_198,0xaa);
  auVar147._0_4_ = fVar201 * auVar33._0_4_;
  auVar147._4_4_ = fVar183 * auVar33._4_4_;
  auVar147._8_4_ = fVar197 * auVar33._8_4_;
  auVar147._12_4_ = fVar198 * auVar33._12_4_;
  auVar32 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar32);
  auVar39 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar165);
  local_1a8 = vsubps_avx(_local_1f8,auVar44);
  uVar95 = local_1a8._0_4_;
  auVar166._4_4_ = uVar95;
  auVar166._0_4_ = uVar95;
  auVar166._8_4_ = uVar95;
  auVar166._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar33 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar186._0_4_ = auVar33._0_4_ * fVar201;
  auVar186._4_4_ = auVar33._4_4_ * fVar183;
  auVar186._8_4_ = auVar33._8_4_ * fVar197;
  auVar186._12_4_ = auVar33._12_4_ * fVar198;
  auVar32 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar2,auVar32);
  auVar35 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar166);
  local_1b8 = vsubps_avx512vl(_local_248,auVar44);
  uVar95 = local_1b8._0_4_;
  auVar167._4_4_ = uVar95;
  auVar167._0_4_ = uVar95;
  auVar167._8_4_ = uVar95;
  auVar167._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar33 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar202._0_4_ = auVar33._0_4_ * fVar201;
  auVar202._4_4_ = auVar33._4_4_ * fVar183;
  auVar202._8_4_ = auVar33._8_4_ * fVar197;
  auVar202._12_4_ = auVar33._12_4_ * fVar198;
  auVar32 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar2,auVar32);
  auVar41 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar167);
  local_1c8 = vsubps_avx512vl(_local_258,auVar44);
  uVar95 = local_1c8._0_4_;
  auVar168._4_4_ = uVar95;
  auVar168._0_4_ = uVar95;
  auVar168._8_4_ = uVar95;
  auVar168._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar33 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar209._0_4_ = auVar33._0_4_ * fVar201;
  auVar209._4_4_ = auVar33._4_4_ * fVar183;
  auVar209._8_4_ = auVar33._8_4_ * fVar197;
  auVar209._12_4_ = auVar33._12_4_ * fVar198;
  auVar32 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar2,auVar32);
  auVar42 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar168);
  local_1d8 = vsubps_avx512vl(_local_218,auVar44);
  uVar95 = local_1d8._0_4_;
  auVar92._4_4_ = uVar95;
  auVar92._0_4_ = uVar95;
  auVar92._8_4_ = uVar95;
  auVar92._12_4_ = uVar95;
  auVar32 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar33 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar155._0_4_ = auVar33._0_4_ * fVar201;
  auVar155._4_4_ = auVar33._4_4_ * fVar183;
  auVar155._8_4_ = auVar33._8_4_ * fVar197;
  auVar155._12_4_ = auVar33._12_4_ * fVar198;
  auVar32 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar2,auVar32);
  auVar43 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar1,auVar92);
  auVar34 = vmovlhps_avx(auVar37,auVar35);
  auVar14 = vmovlhps_avx(auVar36,auVar41);
  auVar40 = vmovlhps_avx512f(auVar38,auVar42);
  _local_328 = vmovlhps_avx512f(auVar39,auVar43);
  auVar33 = vminps_avx(auVar34,auVar14);
  auVar32 = vmaxps_avx(auVar34,auVar14);
  auVar44 = vminps_avx512vl(auVar40,_local_328);
  auVar33 = vminps_avx(auVar33,auVar44);
  auVar44 = vmaxps_avx512vl(auVar40,_local_328);
  auVar32 = vmaxps_avx(auVar32,auVar44);
  auVar44 = vshufpd_avx(auVar33,auVar33,3);
  auVar33 = vminps_avx(auVar33,auVar44);
  auVar44 = vshufpd_avx(auVar32,auVar32,3);
  auVar32 = vmaxps_avx(auVar32,auVar44);
  auVar33 = vandps_avx512vl(auVar33,auVar239._0_16_);
  auVar32 = vandps_avx512vl(auVar32,auVar239._0_16_);
  auVar32 = vmaxps_avx(auVar33,auVar32);
  auVar33 = vmovshdup_avx(auVar32);
  auVar32 = vmaxss_avx(auVar33,auVar32);
  local_2f8 = vmovddup_avx512vl(auVar37);
  local_308 = vmovddup_avx512vl(auVar36);
  auVar98._8_8_ = auVar38._0_8_;
  auVar98._0_8_ = auVar38._0_8_;
  auVar112._8_8_ = auVar39._0_8_;
  auVar112._0_8_ = auVar39._0_8_;
  local_318 = auVar43._0_8_;
  register0x000013c8 = local_318;
  local_338 = ZEXT416((uint)(auVar32._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_338);
  auVar32 = vxorps_avx512vl(local_78._0_16_,auVar237._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar32);
  uVar24 = 0;
  auVar32 = vsubps_avx(auVar14,auVar34);
  auVar44 = vsubps_avx512vl(auVar40,auVar14);
  local_158 = vsubps_avx512vl(_local_328,auVar40);
  local_268 = vsubps_avx(_local_1f8,local_1e8);
  local_278 = vsubps_avx512vl(_local_248,local_228);
  local_288 = vsubps_avx512vl(_local_258,local_238);
  _local_298 = vsubps_avx512vl(_local_218,local_208);
  local_2b8 = vpbroadcastd_avx512vl();
  local_2c8 = vpbroadcastd_avx512vl();
  auVar33 = ZEXT816(0x3f80000000000000);
  auVar182 = ZEXT1664(auVar33);
  do {
    auVar45 = auVar182._0_16_;
    auVar37 = vshufps_avx(auVar45,auVar45,0x50);
    auVar222._8_4_ = 0x3f800000;
    auVar222._0_8_ = &DAT_3f8000003f800000;
    auVar222._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._0_16_ = auVar222;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar36 = vsubps_avx(auVar222,auVar37);
    fVar201 = auVar37._0_4_;
    fVar132 = auVar35._0_4_;
    auVar118._0_4_ = fVar132 * fVar201;
    fVar183 = auVar37._4_4_;
    fVar140 = auVar35._4_4_;
    auVar118._4_4_ = fVar140 * fVar183;
    fVar197 = auVar37._8_4_;
    auVar118._8_4_ = fVar132 * fVar197;
    fVar198 = auVar37._12_4_;
    auVar118._12_4_ = fVar140 * fVar198;
    fVar141 = auVar41._0_4_;
    auVar125._0_4_ = fVar141 * fVar201;
    fVar152 = auVar41._4_4_;
    auVar125._4_4_ = fVar152 * fVar183;
    auVar125._8_4_ = fVar141 * fVar197;
    auVar125._12_4_ = fVar152 * fVar198;
    fVar94 = auVar42._0_4_;
    auVar134._0_4_ = fVar94 * fVar201;
    fVar106 = auVar42._4_4_;
    auVar134._4_4_ = fVar106 * fVar183;
    auVar134._8_4_ = fVar94 * fVar197;
    auVar134._12_4_ = fVar106 * fVar198;
    auVar99._0_4_ = local_318._0_4_ * fVar201;
    auVar99._4_4_ = local_318._4_4_ * fVar183;
    auVar99._8_4_ = local_318._8_4_ * fVar197;
    auVar99._12_4_ = local_318._12_4_ * fVar198;
    auVar38 = vfmadd231ps_avx512vl(auVar118,auVar36,local_2f8);
    auVar39 = vfmadd231ps_avx512vl(auVar125,auVar36,local_308);
    auVar43 = vfmadd231ps_avx512vl(auVar134,auVar36,auVar98);
    auVar36 = vfmadd231ps_fma(auVar99,auVar112,auVar36);
    auVar37 = vmovshdup_avx(auVar33);
    fVar183 = auVar33._0_4_;
    fVar201 = (auVar37._0_4_ - fVar183) * 0.04761905;
    auVar72._4_4_ = fVar183;
    auVar72._0_4_ = fVar183;
    auVar72._8_4_ = fVar183;
    auVar72._12_4_ = fVar183;
    auVar72._16_4_ = fVar183;
    auVar72._20_4_ = fVar183;
    auVar72._24_4_ = fVar183;
    auVar72._28_4_ = fVar183;
    auVar66._0_8_ = auVar37._0_8_;
    auVar66._8_8_ = auVar66._0_8_;
    auVar66._16_8_ = auVar66._0_8_;
    auVar66._24_8_ = auVar66._0_8_;
    auVar71 = vsubps_avx(auVar66,auVar72);
    uVar95 = auVar38._0_4_;
    auVar77._4_4_ = uVar95;
    auVar77._0_4_ = uVar95;
    auVar77._8_4_ = uVar95;
    auVar77._12_4_ = uVar95;
    auVar77._16_4_ = uVar95;
    auVar77._20_4_ = uVar95;
    auVar77._24_4_ = uVar95;
    auVar77._28_4_ = uVar95;
    auVar67._8_4_ = 1;
    auVar67._0_8_ = 0x100000001;
    auVar67._12_4_ = 1;
    auVar67._16_4_ = 1;
    auVar67._20_4_ = 1;
    auVar67._24_4_ = 1;
    auVar67._28_4_ = 1;
    auVar74 = ZEXT1632(auVar38);
    auVar73 = vpermps_avx2(auVar67,auVar74);
    auVar58 = vbroadcastss_avx512vl(auVar39);
    auVar75 = ZEXT1632(auVar39);
    auVar59 = vpermps_avx512vl(auVar67,auVar75);
    auVar60 = vbroadcastss_avx512vl(auVar43);
    auVar68 = ZEXT1632(auVar43);
    auVar61 = vpermps_avx512vl(auVar67,auVar68);
    auVar62 = vbroadcastss_avx512vl(auVar36);
    auVar70 = ZEXT1632(auVar36);
    auVar63 = vpermps_avx512vl(auVar67,auVar70);
    auVar123._4_4_ = fVar201;
    auVar123._0_4_ = fVar201;
    auVar123._8_4_ = fVar201;
    auVar123._12_4_ = fVar201;
    auVar123._16_4_ = fVar201;
    auVar123._20_4_ = fVar201;
    auVar123._24_4_ = fVar201;
    auVar123._28_4_ = fVar201;
    auVar69._8_4_ = 2;
    auVar69._0_8_ = 0x200000002;
    auVar69._12_4_ = 2;
    auVar69._16_4_ = 2;
    auVar69._20_4_ = 2;
    auVar69._24_4_ = 2;
    auVar69._28_4_ = 2;
    auVar64 = vpermps_avx512vl(auVar69,auVar74);
    auVar65 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar66 = vpermps_avx512vl(auVar65,auVar74);
    auVar74 = vpermps_avx2(auVar69,auVar75);
    auVar67 = vpermps_avx512vl(auVar65,auVar75);
    auVar75 = vpermps_avx2(auVar69,auVar68);
    auVar68 = vpermps_avx512vl(auVar65,auVar68);
    auVar69 = vpermps_avx512vl(auVar69,auVar70);
    auVar70 = vpermps_avx512vl(auVar65,auVar70);
    auVar37 = vfmadd132ps_fma(auVar71,auVar72,_DAT_02020f20);
    auVar65 = vsubps_avx(auVar130,ZEXT1632(auVar37));
    auVar71 = vmulps_avx512vl(auVar58,ZEXT1632(auVar37));
    auVar76 = ZEXT1632(auVar37);
    auVar72 = vmulps_avx512vl(auVar59,auVar76);
    auVar36 = vfmadd231ps_fma(auVar71,auVar65,auVar77);
    auVar38 = vfmadd231ps_fma(auVar72,auVar65,auVar73);
    auVar71 = vmulps_avx512vl(auVar60,auVar76);
    auVar72 = vmulps_avx512vl(auVar61,auVar76);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar65,auVar58);
    auVar58 = vfmadd231ps_avx512vl(auVar72,auVar65,auVar59);
    auVar59 = vmulps_avx512vl(auVar62,auVar76);
    auVar77 = ZEXT1632(auVar37);
    auVar63 = vmulps_avx512vl(auVar63,auVar77);
    auVar72 = vfmadd231ps_avx512vl(auVar59,auVar65,auVar60);
    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar65,auVar61);
    fVar197 = auVar37._0_4_;
    fVar198 = auVar37._4_4_;
    auVar59._4_4_ = fVar198 * auVar71._4_4_;
    auVar59._0_4_ = fVar197 * auVar71._0_4_;
    fVar199 = auVar37._8_4_;
    auVar59._8_4_ = fVar199 * auVar71._8_4_;
    fVar200 = auVar37._12_4_;
    auVar59._12_4_ = fVar200 * auVar71._12_4_;
    auVar59._16_4_ = auVar71._16_4_ * 0.0;
    auVar59._20_4_ = auVar71._20_4_ * 0.0;
    auVar59._24_4_ = auVar71._24_4_ * 0.0;
    auVar59._28_4_ = fVar183;
    auVar60._4_4_ = fVar198 * auVar58._4_4_;
    auVar60._0_4_ = fVar197 * auVar58._0_4_;
    auVar60._8_4_ = fVar199 * auVar58._8_4_;
    auVar60._12_4_ = fVar200 * auVar58._12_4_;
    auVar60._16_4_ = auVar58._16_4_ * 0.0;
    auVar60._20_4_ = auVar58._20_4_ * 0.0;
    auVar60._24_4_ = auVar58._24_4_ * 0.0;
    auVar60._28_4_ = auVar73._28_4_;
    auVar36 = vfmadd231ps_fma(auVar59,auVar65,ZEXT1632(auVar36));
    auVar38 = vfmadd231ps_fma(auVar60,auVar65,ZEXT1632(auVar38));
    auVar76._0_4_ = fVar197 * auVar72._0_4_;
    auVar76._4_4_ = fVar198 * auVar72._4_4_;
    auVar76._8_4_ = fVar199 * auVar72._8_4_;
    auVar76._12_4_ = fVar200 * auVar72._12_4_;
    auVar76._16_4_ = auVar72._16_4_ * 0.0;
    auVar76._20_4_ = auVar72._20_4_ * 0.0;
    auVar76._24_4_ = auVar72._24_4_ * 0.0;
    auVar76._28_4_ = 0;
    auVar61._4_4_ = fVar198 * auVar63._4_4_;
    auVar61._0_4_ = fVar197 * auVar63._0_4_;
    auVar61._8_4_ = fVar199 * auVar63._8_4_;
    auVar61._12_4_ = fVar200 * auVar63._12_4_;
    auVar61._16_4_ = auVar63._16_4_ * 0.0;
    auVar61._20_4_ = auVar63._20_4_ * 0.0;
    auVar61._24_4_ = auVar63._24_4_ * 0.0;
    auVar61._28_4_ = auVar72._28_4_;
    auVar39 = vfmadd231ps_fma(auVar76,auVar65,auVar71);
    auVar43 = vfmadd231ps_fma(auVar61,auVar65,auVar58);
    auVar63._28_4_ = auVar58._28_4_;
    auVar63._0_28_ =
         ZEXT1628(CONCAT412(fVar200 * auVar43._12_4_,
                            CONCAT48(fVar199 * auVar43._8_4_,
                                     CONCAT44(fVar198 * auVar43._4_4_,fVar197 * auVar43._0_4_))));
    auVar71._16_16_ =
         vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar39._12_4_,
                                            CONCAT48(fVar199 * auVar39._8_4_,
                                                     CONCAT44(fVar198 * auVar39._4_4_,
                                                              fVar197 * auVar39._0_4_)))),auVar65,
                         ZEXT1632(auVar36));
    auVar52 = vfmadd231ps_fma(auVar63,auVar65,ZEXT1632(auVar38));
    auVar73 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar36));
    auVar58 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar38));
    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar73 = vmulps_avx512vl(auVar73,auVar59);
    auVar58 = vmulps_avx512vl(auVar58,auVar59);
    auVar78._0_4_ = fVar201 * auVar73._0_4_;
    auVar78._4_4_ = fVar201 * auVar73._4_4_;
    auVar78._8_4_ = fVar201 * auVar73._8_4_;
    auVar78._12_4_ = fVar201 * auVar73._12_4_;
    auVar78._16_4_ = fVar201 * auVar73._16_4_;
    auVar78._20_4_ = fVar201 * auVar73._20_4_;
    auVar78._24_4_ = fVar201 * auVar73._24_4_;
    auVar78._28_4_ = 0;
    auVar73 = vmulps_avx512vl(auVar123,auVar58);
    auVar39 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
    auVar58 = vpermt2ps_avx512vl(ZEXT1632(auVar71._16_16_),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar60 = vpermt2ps_avx512vl(ZEXT1632(auVar52),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar105._0_4_ = auVar78._0_4_ + auVar71._16_4_;
    auVar105._4_4_ = auVar78._4_4_ + auVar71._20_4_;
    auVar105._8_4_ = auVar78._8_4_ + auVar71._24_4_;
    auVar105._12_4_ = auVar78._12_4_ + auVar71._28_4_;
    auVar105._16_4_ = auVar78._16_4_ + 0.0;
    auVar105._20_4_ = auVar78._20_4_ + 0.0;
    auVar105._24_4_ = auVar78._24_4_ + 0.0;
    auVar105._28_4_ = 0;
    auVar76 = ZEXT1632(auVar39);
    auVar61 = vpermt2ps_avx512vl(auVar78,_DAT_0205fd20,auVar76);
    auVar63 = vaddps_avx512vl(ZEXT1632(auVar52),auVar73);
    auVar62 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar76);
    auVar73 = vsubps_avx(auVar58,auVar61);
    auVar61 = vsubps_avx512vl(auVar60,auVar62);
    auVar62 = vmulps_avx512vl(auVar74,auVar77);
    auVar72 = vmulps_avx512vl(auVar67,auVar77);
    auVar62 = vfmadd231ps_avx512vl(auVar62,auVar65,auVar64);
    auVar64 = vfmadd231ps_avx512vl(auVar72,auVar65,auVar66);
    auVar66 = vmulps_avx512vl(auVar75,auVar77);
    auVar72 = vmulps_avx512vl(auVar68,auVar77);
    auVar74 = vfmadd231ps_avx512vl(auVar66,auVar65,auVar74);
    auVar66 = vfmadd231ps_avx512vl(auVar72,auVar65,auVar67);
    auVar67 = vmulps_avx512vl(auVar69,auVar77);
    auVar69 = vmulps_avx512vl(auVar70,auVar77);
    auVar36 = vfmadd231ps_fma(auVar67,auVar65,auVar75);
    auVar38 = vfmadd231ps_fma(auVar69,auVar65,auVar68);
    auVar67 = vmulps_avx512vl(auVar77,auVar74);
    auVar69 = vmulps_avx512vl(ZEXT1632(auVar37),auVar66);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar65,auVar62);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar65,auVar64);
    auVar74 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar200 * auVar36._12_4_,
                                            CONCAT48(fVar199 * auVar36._8_4_,
                                                     CONCAT44(fVar198 * auVar36._4_4_,
                                                              fVar197 * auVar36._0_4_)))),auVar65,
                         auVar74);
    auVar66 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar200 * auVar38._12_4_,
                                            CONCAT48(fVar199 * auVar38._8_4_,
                                                     CONCAT44(fVar198 * auVar38._4_4_,
                                                              fVar197 * auVar38._0_4_)))),auVar65,
                         auVar66);
    auVar62._4_4_ = fVar198 * auVar74._4_4_;
    auVar62._0_4_ = fVar197 * auVar74._0_4_;
    auVar62._8_4_ = fVar199 * auVar74._8_4_;
    auVar62._12_4_ = fVar200 * auVar74._12_4_;
    auVar62._16_4_ = auVar74._16_4_ * 0.0;
    auVar62._20_4_ = auVar74._20_4_ * 0.0;
    auVar62._24_4_ = auVar74._24_4_ * 0.0;
    auVar62._28_4_ = auVar68._28_4_;
    auVar64._4_4_ = fVar198 * auVar66._4_4_;
    auVar64._0_4_ = fVar197 * auVar66._0_4_;
    auVar64._8_4_ = fVar199 * auVar66._8_4_;
    auVar64._12_4_ = fVar200 * auVar66._12_4_;
    auVar64._16_4_ = auVar66._16_4_ * 0.0;
    auVar64._20_4_ = auVar66._20_4_ * 0.0;
    auVar64._24_4_ = auVar66._24_4_ * 0.0;
    auVar64._28_4_ = auVar75._28_4_;
    auVar62 = vfmadd231ps_avx512vl(auVar62,auVar65,auVar67);
    auVar64 = vfmadd231ps_avx512vl(auVar64,auVar69,auVar65);
    auVar65 = vsubps_avx512vl(auVar74,auVar67);
    auVar74 = vsubps_avx512vl(auVar66,auVar69);
    auVar65 = vmulps_avx512vl(auVar65,auVar59);
    auVar74 = vmulps_avx512vl(auVar74,auVar59);
    fVar183 = fVar201 * auVar65._0_4_;
    fVar197 = fVar201 * auVar65._4_4_;
    auVar75._4_4_ = fVar197;
    auVar75._0_4_ = fVar183;
    fVar198 = fVar201 * auVar65._8_4_;
    auVar75._8_4_ = fVar198;
    fVar199 = fVar201 * auVar65._12_4_;
    auVar75._12_4_ = fVar199;
    fVar200 = fVar201 * auVar65._16_4_;
    auVar75._16_4_ = fVar200;
    fVar208 = fVar201 * auVar65._20_4_;
    auVar75._20_4_ = fVar208;
    fVar201 = fVar201 * auVar65._24_4_;
    auVar75._24_4_ = fVar201;
    auVar75._28_4_ = auVar65._28_4_;
    auVar74 = vmulps_avx512vl(auVar123,auVar74);
    auVar59 = vpermt2ps_avx512vl(auVar62,_DAT_0205fd20,auVar76);
    auVar66 = vpermt2ps_avx512vl(auVar64,_DAT_0205fd20,auVar76);
    auVar181._0_4_ = auVar62._0_4_ + fVar183;
    auVar181._4_4_ = auVar62._4_4_ + fVar197;
    auVar181._8_4_ = auVar62._8_4_ + fVar198;
    auVar181._12_4_ = auVar62._12_4_ + fVar199;
    auVar181._16_4_ = auVar62._16_4_ + fVar200;
    auVar181._20_4_ = auVar62._20_4_ + fVar208;
    auVar181._24_4_ = auVar62._24_4_ + fVar201;
    auVar181._28_4_ = auVar62._28_4_ + auVar65._28_4_;
    auVar65 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar75 = vaddps_avx512vl(auVar64,auVar74);
    auVar74 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar65 = vsubps_avx(auVar59,auVar65);
    auVar74 = vsubps_avx512vl(auVar66,auVar74);
    auVar123 = ZEXT1632(auVar71._16_16_);
    auVar71 = vsubps_avx512vl(auVar62,auVar123);
    auVar130 = ZEXT1632(auVar52);
    auVar67 = vsubps_avx512vl(auVar64,auVar130);
    auVar68 = vsubps_avx512vl(auVar59,auVar58);
    auVar71 = vaddps_avx512vl(auVar71,auVar68);
    auVar68 = vsubps_avx512vl(auVar66,auVar60);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar130,auVar71);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar123,auVar67);
    auVar69 = vmulps_avx512vl(auVar63,auVar71);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar105,auVar67);
    auVar70 = vmulps_avx512vl(auVar61,auVar71);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar73,auVar67);
    auVar72 = vmulps_avx512vl(auVar60,auVar71);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar58,auVar67);
    auVar76 = vmulps_avx512vl(auVar64,auVar71);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar62,auVar67);
    auVar77 = vmulps_avx512vl(auVar75,auVar71);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar181,auVar67);
    auVar78 = vmulps_avx512vl(auVar74,auVar71);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar65,auVar67);
    auVar71 = vmulps_avx512vl(auVar66,auVar71);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar59,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar69);
    auVar68 = vmaxps_avx512vl(auVar68,auVar69);
    auVar69 = vminps_avx512vl(auVar70,auVar72);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar69 = vmaxps_avx512vl(auVar70,auVar72);
    auVar68 = vmaxps_avx512vl(auVar68,auVar69);
    auVar69 = vminps_avx512vl(auVar76,auVar77);
    auVar70 = vmaxps_avx512vl(auVar76,auVar77);
    auVar72 = vminps_avx512vl(auVar78,auVar71);
    auVar69 = vminps_avx512vl(auVar69,auVar72);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar71 = vmaxps_avx512vl(auVar78,auVar71);
    auVar71 = vmaxps_avx512vl(auVar70,auVar71);
    auVar71 = vmaxps_avx512vl(auVar68,auVar71);
    uVar15 = vcmpps_avx512vl(auVar67,local_78,2);
    uVar16 = vcmpps_avx512vl(auVar71,local_98,5);
    uVar26 = 0;
    bVar22 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar22 != 0) {
      auVar71 = vsubps_avx512vl(auVar58,auVar123);
      auVar67 = vsubps_avx512vl(auVar60,auVar130);
      auVar68 = vsubps_avx512vl(auVar59,auVar62);
      auVar71 = vaddps_avx512vl(auVar71,auVar68);
      auVar68 = vsubps_avx512vl(auVar66,auVar64);
      auVar67 = vaddps_avx512vl(auVar67,auVar68);
      auVar68 = vmulps_avx512vl(auVar130,auVar71);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar123);
      auVar63 = vmulps_avx512vl(auVar63,auVar71);
      auVar63 = vfnmadd213ps_avx512vl(auVar105,auVar67,auVar63);
      auVar61 = vmulps_avx512vl(auVar61,auVar71);
      auVar61 = vfnmadd213ps_avx512vl(auVar73,auVar67,auVar61);
      auVar73 = vmulps_avx512vl(auVar60,auVar71);
      auVar58 = vfnmadd231ps_avx512vl(auVar73,auVar67,auVar58);
      auVar73 = vmulps_avx512vl(auVar64,auVar71);
      auVar60 = vfnmadd231ps_avx512vl(auVar73,auVar67,auVar62);
      auVar73 = vmulps_avx512vl(auVar75,auVar71);
      auVar75 = vfnmadd213ps_avx512vl(auVar181,auVar67,auVar73);
      auVar73 = vmulps_avx512vl(auVar74,auVar71);
      auVar62 = vfnmadd213ps_avx512vl(auVar65,auVar67,auVar73);
      auVar71 = vmulps_avx512vl(auVar66,auVar71);
      auVar59 = vfnmadd231ps_avx512vl(auVar71,auVar59,auVar67);
      auVar65 = vminps_avx(auVar68,auVar63);
      auVar71 = vmaxps_avx(auVar68,auVar63);
      auVar73 = vminps_avx(auVar61,auVar58);
      auVar73 = vminps_avx(auVar65,auVar73);
      auVar65 = vmaxps_avx(auVar61,auVar58);
      auVar71 = vmaxps_avx(auVar71,auVar65);
      auVar58 = vminps_avx(auVar60,auVar75);
      auVar65 = vmaxps_avx(auVar60,auVar75);
      auVar74 = vminps_avx(auVar62,auVar59);
      auVar58 = vminps_avx(auVar58,auVar74);
      auVar58 = vminps_avx(auVar73,auVar58);
      auVar73 = vmaxps_avx(auVar62,auVar59);
      auVar65 = vmaxps_avx(auVar65,auVar73);
      auVar71 = vmaxps_avx(auVar71,auVar65);
      uVar15 = vcmpps_avx512vl(auVar71,local_98,5);
      uVar16 = vcmpps_avx512vl(auVar58,local_78,2);
      uVar26 = (uint)(bVar22 & (byte)uVar15 & (byte)uVar16);
    }
    if (uVar26 != 0) {
      auStack_2e8[uVar24] = uVar26;
      uVar15 = vmovlps_avx(auVar33);
      *(undefined8 *)(&uStack_148 + uVar24 * 2) = uVar15;
      uVar31 = vmovlps_avx512f(auVar45);
      auStack_58[uVar24] = uVar31;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar237 = ZEXT1664(auVar33);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM19 = ZEXT3264(auVar71);
    auVar238 = ZEXT464(0x3f800000);
    do {
      if ((int)uVar24 == 0) {
        uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar18._4_4_ = uVar95;
        auVar18._0_4_ = uVar95;
        auVar18._8_4_ = uVar95;
        auVar18._12_4_ = uVar95;
        uVar15 = vcmpps_avx512vl(local_2a8,auVar18,2);
        uVar29 = (uint)uVar30 & (uint)uVar30 + 0xf & (uint)uVar15;
        uVar30 = (ulong)uVar29;
        if (uVar29 == 0) {
          return;
        }
        goto LAB_01b3acb7;
      }
      uVar23 = (int)uVar24 - 1;
      uVar25 = (ulong)uVar23;
      uVar26 = (&uStack_148)[uVar25 * 2];
      fVar201 = afStack_144[uVar25 * 2];
      uVar5 = auStack_2e8[uVar25];
      auVar177._8_8_ = 0;
      auVar177._0_8_ = auStack_58[uVar25];
      auVar182 = ZEXT1664(auVar177);
      lVar28 = 0;
      for (uVar31 = (ulong)uVar5; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar27 = uVar5 - 1 & uVar5;
      auStack_2e8[uVar25] = uVar27;
      if (uVar27 == 0) {
        uVar24 = (ulong)uVar23;
      }
      auVar113._0_4_ = (float)lVar28;
      auVar113._4_8_ = SUB128(ZEXT812(0),4);
      auVar113._12_4_ = 0;
      auVar33 = vmulss_avx512f(auVar113,SUB6416(ZEXT464(0x3e124925),0));
      lVar28 = lVar28 + 1;
      auVar37 = vmulss_avx512f(ZEXT416((uint)(float)lVar28),SUB6416(ZEXT464(0x3e124925),0));
      auVar38 = auVar238._0_16_;
      auVar36 = vsubss_avx512f(auVar38,auVar33);
      auVar33 = vmulss_avx512f(ZEXT416((uint)fVar201),auVar33);
      auVar36 = vfmadd231ss_avx512f(auVar33,ZEXT416(uVar26),auVar36);
      auVar33 = vsubss_avx512f(auVar38,auVar37);
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar37._0_4_)),ZEXT416(uVar26),auVar33);
      auVar37 = vsubss_avx512f(auVar33,auVar36);
      vucomiss_avx512f(auVar37);
      if (uVar5 == 0 || lVar28 == 0) break;
      auVar39 = vshufps_avx(auVar177,auVar177,0x50);
      vucomiss_avx512f(auVar37);
      auVar142 = auVar240._0_16_;
      auVar71._16_16_ = vsubps_avx512vl(auVar142,auVar39);
      fVar201 = auVar39._0_4_;
      auVar119._0_4_ = fVar132 * fVar201;
      fVar183 = auVar39._4_4_;
      auVar119._4_4_ = fVar140 * fVar183;
      fVar197 = auVar39._8_4_;
      auVar119._8_4_ = fVar132 * fVar197;
      fVar198 = auVar39._12_4_;
      auVar119._12_4_ = fVar140 * fVar198;
      auVar126._0_4_ = fVar141 * fVar201;
      auVar126._4_4_ = fVar152 * fVar183;
      auVar126._8_4_ = fVar141 * fVar197;
      auVar126._12_4_ = fVar152 * fVar198;
      auVar135._0_4_ = fVar94 * fVar201;
      auVar135._4_4_ = fVar106 * fVar183;
      auVar135._8_4_ = fVar94 * fVar197;
      auVar135._12_4_ = fVar106 * fVar198;
      auVar100._0_4_ = fVar201 * (float)local_318._0_4_;
      auVar100._4_4_ = fVar183 * (float)local_318._4_4_;
      auVar100._8_4_ = fVar197 * fStack_310;
      auVar100._12_4_ = fVar198 * fStack_30c;
      auVar39 = vfmadd231ps_fma(auVar119,auVar71._16_16_,local_2f8);
      auVar43 = vfmadd231ps_fma(auVar126,auVar71._16_16_,local_308);
      auVar45 = vfmadd231ps_avx512vl(auVar135,auVar71._16_16_,auVar98);
      auVar71._16_16_ = vfmadd231ps_fma(auVar100,auVar112,auVar71._16_16_);
      auVar68._16_16_ = auVar39;
      auVar68._0_16_ = auVar39;
      auVar70._16_16_ = auVar43;
      auVar70._0_16_ = auVar43;
      auVar131._16_16_ = auVar45;
      auVar131._0_16_ = auVar45;
      uVar95 = auVar36._0_4_;
      auVar151._4_4_ = uVar95;
      auVar151._0_4_ = uVar95;
      auVar151._8_4_ = uVar95;
      auVar151._12_4_ = uVar95;
      uVar95 = auVar33._0_4_;
      auVar151._20_4_ = uVar95;
      auVar151._16_4_ = uVar95;
      auVar151._24_4_ = uVar95;
      auVar151._28_4_ = uVar95;
      auVar65 = vsubps_avx(auVar70,auVar68);
      auVar43 = vfmadd213ps_fma(auVar65,auVar151,auVar68);
      auVar65 = vsubps_avx(auVar131,auVar70);
      auVar52 = vfmadd213ps_fma(auVar65,auVar151,auVar70);
      auVar39 = vsubps_avx(auVar71._16_16_,auVar45);
      auVar124._16_16_ = auVar39;
      auVar124._0_16_ = auVar39;
      auVar39 = vfmadd213ps_fma(auVar124,auVar151,auVar131);
      auVar71 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar43));
      auVar43 = vfmadd213ps_fma(auVar71,auVar151,ZEXT1632(auVar43));
      auVar71 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar52));
      auVar39 = vfmadd213ps_fma(auVar71,auVar151,ZEXT1632(auVar52));
      auVar71 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar43));
      auVar50 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar71,auVar151);
      auVar71 = vmulps_avx512vl(auVar71,in_ZMM19._0_32_);
      auVar39 = vmulss_avx512f(auVar37,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar201 = auVar39._0_4_;
      auVar136._0_8_ =
           CONCAT44(auVar50._4_4_ + fVar201 * auVar71._4_4_,auVar50._0_4_ + fVar201 * auVar71._0_4_)
      ;
      auVar136._8_4_ = auVar50._8_4_ + fVar201 * auVar71._8_4_;
      auVar136._12_4_ = auVar50._12_4_ + fVar201 * auVar71._12_4_;
      auVar120._0_4_ = fVar201 * auVar71._16_4_;
      auVar120._4_4_ = fVar201 * auVar71._20_4_;
      auVar120._8_4_ = fVar201 * auVar71._24_4_;
      auVar120._12_4_ = fVar201 * auVar71._28_4_;
      auVar57 = vsubps_avx((undefined1  [16])0x0,auVar120);
      auVar55 = vshufpd_avx(auVar50,auVar50,3);
      auVar51 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar39 = vsubps_avx(auVar55,auVar50);
      auVar43 = vsubps_avx(auVar51,(undefined1  [16])0x0);
      auVar156._0_4_ = auVar43._0_4_ + auVar39._0_4_;
      auVar156._4_4_ = auVar43._4_4_ + auVar39._4_4_;
      auVar156._8_4_ = auVar43._8_4_ + auVar39._8_4_;
      auVar156._12_4_ = auVar43._12_4_ + auVar39._12_4_;
      auVar39 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar43 = vshufps_avx(auVar136,auVar136,0xb1);
      auVar52 = vshufps_avx(auVar57,auVar57,0xb1);
      auVar45 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar210._4_4_ = auVar156._0_4_;
      auVar210._0_4_ = auVar156._0_4_;
      auVar210._8_4_ = auVar156._0_4_;
      auVar210._12_4_ = auVar156._0_4_;
      auVar53 = vshufps_avx(auVar156,auVar156,0x55);
      fVar201 = auVar53._0_4_;
      auVar169._0_4_ = auVar39._0_4_ * fVar201;
      fVar183 = auVar53._4_4_;
      auVar169._4_4_ = auVar39._4_4_ * fVar183;
      fVar197 = auVar53._8_4_;
      auVar169._8_4_ = auVar39._8_4_ * fVar197;
      fVar198 = auVar53._12_4_;
      auVar169._12_4_ = auVar39._12_4_ * fVar198;
      auVar178._0_4_ = auVar43._0_4_ * fVar201;
      auVar178._4_4_ = auVar43._4_4_ * fVar183;
      auVar178._8_4_ = auVar43._8_4_ * fVar197;
      auVar178._12_4_ = auVar43._12_4_ * fVar198;
      auVar187._0_4_ = auVar52._0_4_ * fVar201;
      auVar187._4_4_ = auVar52._4_4_ * fVar183;
      auVar187._8_4_ = auVar52._8_4_ * fVar197;
      auVar187._12_4_ = auVar52._12_4_ * fVar198;
      auVar157._0_4_ = auVar45._0_4_ * fVar201;
      auVar157._4_4_ = auVar45._4_4_ * fVar183;
      auVar157._8_4_ = auVar45._8_4_ * fVar197;
      auVar157._12_4_ = auVar45._12_4_ * fVar198;
      auVar39 = vfmadd231ps_fma(auVar169,auVar210,auVar50);
      auVar43 = vfmadd231ps_fma(auVar178,auVar210,auVar136);
      auVar53 = vfmadd231ps_fma(auVar187,auVar210,auVar57);
      auVar49 = vfmadd231ps_fma(auVar157,(undefined1  [16])0x0,auVar210);
      auVar54 = vshufpd_avx(auVar39,auVar39,1);
      auVar46 = vshufpd_avx(auVar43,auVar43,1);
      auVar47 = vshufpd_avx(auVar53,auVar53,1);
      auVar48 = vshufpd_avx(auVar49,auVar49,1);
      auVar52 = vminss_avx(auVar39,auVar43);
      auVar39 = vmaxss_avx(auVar43,auVar39);
      auVar45 = vminss_avx(auVar53,auVar49);
      auVar43 = vmaxss_avx(auVar49,auVar53);
      auVar45 = vminss_avx(auVar52,auVar45);
      auVar39 = vmaxss_avx(auVar43,auVar39);
      auVar53 = vminss_avx(auVar54,auVar46);
      auVar43 = vmaxss_avx(auVar46,auVar54);
      auVar54 = vminss_avx(auVar47,auVar48);
      auVar52 = vmaxss_avx(auVar48,auVar47);
      auVar53 = vminss_avx(auVar53,auVar54);
      auVar43 = vmaxss_avx(auVar52,auVar43);
      vucomiss_avx512f(auVar45);
      fVar183 = auVar43._0_4_;
      fVar201 = auVar39._0_4_;
      if (((uint)uVar24 < 5) || (fVar183 <= -0.0001)) {
        uVar15 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar16 = vcmpps_avx512vl(auVar45,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar201 & ((byte)uVar16 | (byte)uVar15)) != 0) goto LAB_01b3bb9f;
        uVar15 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar43,5);
        uVar16 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar16 | (ushort)uVar15) & 1) == 0) goto LAB_01b3bb9f;
LAB_01b3c5f8:
        bVar10 = true;
        auVar182 = ZEXT1664(auVar177);
      }
      else {
LAB_01b3bb9f:
        auVar46 = auVar242._0_16_;
        uVar15 = vcmpss_avx512f(auVar45,auVar46,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        iVar90 = auVar238._0_4_;
        fVar197 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar90);
        uVar15 = vcmpss_avx512f(auVar39,auVar46,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        fVar198 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar90);
        bVar10 = fVar197 != fVar198;
        iVar241 = auVar242._0_4_;
        auVar71._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar79._4_28_ = auVar71._4_28_;
        auVar79._0_4_ = (uint)bVar10 * iVar241 + (uint)!bVar10 * 0x7f800000;
        auVar54 = auVar79._0_16_;
        auVar81._16_16_ = auVar71._16_16_;
        auVar81._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar80._4_28_ = auVar81._4_28_;
        auVar80._0_4_ = (uint)bVar10 * iVar241 + (uint)!bVar10 * -0x800000;
        auVar52 = auVar80._0_16_;
        uVar15 = vcmpss_avx512f(auVar53,auVar46,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        fVar199 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar90);
        if ((fVar197 != fVar199) || (NAN(fVar197) || NAN(fVar199))) {
          fVar200 = auVar53._0_4_;
          fVar197 = auVar45._0_4_;
          bVar10 = fVar200 == fVar197;
          if ((!bVar10) || (NAN(fVar200) || NAN(fVar197))) {
            auVar45 = vxorps_avx512vl(auVar45,auVar237._0_16_);
            auVar230._0_4_ = auVar45._0_4_ / (fVar200 - fVar197);
            auVar230._4_12_ = auVar45._4_12_;
            auVar45 = vsubss_avx512f(auVar38,auVar230);
            auVar53 = vfmadd213ss_avx512f(auVar45,auVar46,auVar230);
            auVar45 = auVar53;
          }
          else {
            vucomiss_avx512f(auVar46);
            auVar83._16_16_ = auVar71._16_16_;
            auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar82._4_28_ = auVar83._4_28_;
            auVar82._0_4_ = (uint)bVar10 * iVar241 + (uint)!bVar10 * 0x7f800000;
            auVar53 = auVar82._0_16_;
            auVar45 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar54 = vminss_avx(auVar54,auVar53);
          auVar52 = vmaxss_avx(auVar45,auVar52);
        }
        uVar15 = vcmpss_avx512f(auVar43,auVar46,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        fVar197 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar90);
        if ((fVar198 != fVar197) || (NAN(fVar198) || NAN(fVar197))) {
          bVar10 = fVar183 == fVar201;
          if ((!bVar10) || (NAN(fVar183) || NAN(fVar201))) {
            auVar39 = vxorps_avx512vl(auVar39,auVar237._0_16_);
            auVar188._0_4_ = auVar39._0_4_ / (fVar183 - fVar201);
            auVar188._4_12_ = auVar39._4_12_;
            auVar39 = vsubss_avx512f(auVar38,auVar188);
            auVar43 = vfmadd213ss_avx512f(auVar39,auVar46,auVar188);
            auVar39 = auVar43;
          }
          else {
            vucomiss_avx512f(auVar46);
            auVar85._16_16_ = auVar71._16_16_;
            auVar85._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar84._4_28_ = auVar85._4_28_;
            auVar84._0_4_ = (uint)bVar10 * iVar241 + (uint)!bVar10 * 0x7f800000;
            auVar43 = auVar84._0_16_;
            auVar39 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar54 = vminss_avx(auVar54,auVar43);
          auVar52 = vmaxss_avx(auVar39,auVar52);
        }
        bVar10 = fVar199 != fVar197;
        auVar39 = vminss_avx512f(auVar54,auVar38);
        auVar87._16_16_ = auVar71._16_16_;
        auVar87._0_16_ = auVar54;
        auVar86._4_28_ = auVar87._4_28_;
        auVar86._0_4_ = (uint)bVar10 * auVar39._0_4_ + (uint)!bVar10 * auVar54._0_4_;
        auVar39 = vmaxss_avx512f(auVar38,auVar52);
        auVar89._16_16_ = auVar71._16_16_;
        auVar89._0_16_ = auVar52;
        auVar88._4_28_ = auVar89._4_28_;
        auVar88._0_4_ = (uint)bVar10 * auVar39._0_4_ + (uint)!bVar10 * auVar52._0_4_;
        auVar39 = vmaxss_avx512f(auVar46,auVar86._0_16_);
        auVar43 = vminss_avx512f(auVar88._0_16_,auVar38);
        bVar10 = true;
        if (auVar43._0_4_ < auVar39._0_4_) goto LAB_01b3c5f8;
        auVar46 = vmaxss_avx512f(auVar46,ZEXT416((uint)(auVar39._0_4_ + -0.1)));
        auVar47 = vminss_avx512f(ZEXT416((uint)(auVar43._0_4_ + 0.1)),auVar38);
        auVar101._0_8_ = auVar50._0_8_;
        auVar101._8_8_ = auVar101._0_8_;
        auVar179._8_8_ = auVar136._0_8_;
        auVar179._0_8_ = auVar136._0_8_;
        auVar189._8_8_ = auVar57._0_8_;
        auVar189._0_8_ = auVar57._0_8_;
        auVar39 = vshufpd_avx(auVar136,auVar136,3);
        auVar43 = vshufpd_avx(auVar57,auVar57,3);
        auVar52 = vshufps_avx(auVar46,auVar47,0);
        auVar48 = vsubps_avx512vl(auVar142,auVar52);
        fVar201 = auVar52._0_4_;
        auVar223._0_4_ = fVar201 * auVar55._0_4_;
        fVar183 = auVar52._4_4_;
        auVar223._4_4_ = fVar183 * auVar55._4_4_;
        fVar197 = auVar52._8_4_;
        auVar223._8_4_ = fVar197 * auVar55._8_4_;
        fVar198 = auVar52._12_4_;
        auVar223._12_4_ = fVar198 * auVar55._12_4_;
        auVar137._0_4_ = fVar201 * auVar39._0_4_;
        auVar137._4_4_ = fVar183 * auVar39._4_4_;
        auVar137._8_4_ = fVar197 * auVar39._8_4_;
        auVar137._12_4_ = fVar198 * auVar39._12_4_;
        auVar148._0_4_ = fVar201 * auVar43._0_4_;
        auVar148._4_4_ = fVar183 * auVar43._4_4_;
        auVar148._8_4_ = fVar197 * auVar43._8_4_;
        auVar148._12_4_ = fVar198 * auVar43._12_4_;
        auVar121._0_4_ = fVar201 * auVar51._0_4_;
        auVar121._4_4_ = fVar183 * auVar51._4_4_;
        auVar121._8_4_ = fVar197 * auVar51._8_4_;
        auVar121._12_4_ = fVar198 * auVar51._12_4_;
        auVar45 = vfmadd231ps_fma(auVar223,auVar48,auVar101);
        auVar53 = vfmadd231ps_fma(auVar137,auVar48,auVar179);
        auVar54 = vfmadd231ps_fma(auVar148,auVar48,auVar189);
        auVar55 = vfmadd231ps_fma(auVar121,auVar48,ZEXT816(0));
        auVar39 = vsubss_avx512f(auVar38,auVar46);
        auVar43 = vmovshdup_avx512vl(auVar177);
        auVar49 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar46._0_4_)),auVar177,
                                      auVar39);
        auVar39 = vsubss_avx512f(auVar38,auVar47);
        auVar50 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar47._0_4_ * auVar43._0_4_)),auVar177,
                                      auVar39);
        auVar51 = vdivss_avx512f(auVar38,auVar37);
        auVar37 = vsubps_avx(auVar53,auVar45);
        auVar220 = auVar236._0_16_;
        auVar43 = vmulps_avx512vl(auVar37,auVar220);
        auVar37 = vsubps_avx(auVar54,auVar53);
        auVar52 = vmulps_avx512vl(auVar37,auVar220);
        auVar37 = vsubps_avx(auVar55,auVar54);
        auVar37 = vmulps_avx512vl(auVar37,auVar220);
        auVar39 = vminps_avx(auVar52,auVar37);
        auVar37 = vmaxps_avx(auVar52,auVar37);
        auVar39 = vminps_avx(auVar43,auVar39);
        auVar37 = vmaxps_avx(auVar43,auVar37);
        auVar43 = vshufpd_avx(auVar39,auVar39,3);
        auVar52 = vshufpd_avx(auVar37,auVar37,3);
        auVar39 = vminps_avx(auVar39,auVar43);
        auVar37 = vmaxps_avx(auVar37,auVar52);
        fVar201 = auVar51._0_4_;
        auVar170._0_4_ = fVar201 * auVar39._0_4_;
        auVar170._4_4_ = fVar201 * auVar39._4_4_;
        auVar170._8_4_ = fVar201 * auVar39._8_4_;
        auVar170._12_4_ = fVar201 * auVar39._12_4_;
        auVar158._0_4_ = fVar201 * auVar37._0_4_;
        auVar158._4_4_ = fVar201 * auVar37._4_4_;
        auVar158._8_4_ = fVar201 * auVar37._8_4_;
        auVar158._12_4_ = fVar201 * auVar37._12_4_;
        auVar51 = vdivss_avx512f(auVar38,ZEXT416((uint)(auVar50._0_4_ - auVar49._0_4_)));
        auVar37 = vshufpd_avx(auVar45,auVar45,3);
        auVar39 = vshufpd_avx(auVar53,auVar53,3);
        auVar43 = vshufpd_avx(auVar54,auVar54,3);
        auVar52 = vshufpd_avx(auVar55,auVar55,3);
        auVar37 = vsubps_avx(auVar37,auVar45);
        auVar45 = vsubps_avx(auVar39,auVar53);
        auVar53 = vsubps_avx(auVar43,auVar54);
        auVar52 = vsubps_avx(auVar52,auVar55);
        auVar39 = vminps_avx(auVar37,auVar45);
        auVar37 = vmaxps_avx(auVar37,auVar45);
        auVar43 = vminps_avx(auVar53,auVar52);
        auVar43 = vminps_avx(auVar39,auVar43);
        auVar39 = vmaxps_avx(auVar53,auVar52);
        auVar37 = vmaxps_avx(auVar37,auVar39);
        fVar201 = auVar51._0_4_;
        auVar190._0_4_ = fVar201 * auVar43._0_4_;
        auVar190._4_4_ = fVar201 * auVar43._4_4_;
        auVar190._8_4_ = fVar201 * auVar43._8_4_;
        auVar190._12_4_ = fVar201 * auVar43._12_4_;
        auVar203._0_4_ = fVar201 * auVar37._0_4_;
        auVar203._4_4_ = fVar201 * auVar37._4_4_;
        auVar203._8_4_ = fVar201 * auVar37._8_4_;
        auVar203._12_4_ = fVar201 * auVar37._12_4_;
        auVar57 = vinsertps_avx512f(auVar36,auVar49,0x10);
        auVar45 = vinsertps_avx(auVar33,auVar50,0x10);
        auVar93._0_4_ = auVar57._0_4_ + auVar45._0_4_;
        auVar93._4_4_ = auVar57._4_4_ + auVar45._4_4_;
        auVar93._8_4_ = auVar57._8_4_ + auVar45._8_4_;
        auVar93._12_4_ = auVar57._12_4_ + auVar45._12_4_;
        auVar17._8_4_ = 0x3f000000;
        auVar17._0_8_ = 0x3f0000003f000000;
        auVar17._12_4_ = 0x3f000000;
        auVar47 = vmulps_avx512vl(auVar93,auVar17);
        auVar43 = vshufps_avx(auVar47,auVar47,0x54);
        uVar95 = auVar47._0_4_;
        auVar114._4_4_ = uVar95;
        auVar114._0_4_ = uVar95;
        auVar114._8_4_ = uVar95;
        auVar114._12_4_ = uVar95;
        auVar39 = vfmadd213ps_fma(auVar32,auVar114,auVar34);
        auVar53 = vfmadd213ps_avx512vl(auVar44,auVar114,auVar14);
        auVar52 = vfmadd213ps_fma(local_158,auVar114,auVar40);
        auVar37 = vsubps_avx(auVar53,auVar39);
        auVar39 = vfmadd213ps_fma(auVar37,auVar114,auVar39);
        auVar37 = vsubps_avx(auVar52,auVar53);
        auVar37 = vfmadd213ps_fma(auVar37,auVar114,auVar53);
        auVar37 = vsubps_avx(auVar37,auVar39);
        auVar39 = vfmadd231ps_fma(auVar39,auVar37,auVar114);
        auVar54 = vmulps_avx512vl(auVar37,auVar220);
        auVar211._8_8_ = auVar39._0_8_;
        auVar211._0_8_ = auVar39._0_8_;
        auVar37 = vshufpd_avx(auVar39,auVar39,3);
        auVar39 = vshufps_avx(auVar47,auVar47,0x55);
        auVar52 = vsubps_avx(auVar37,auVar211);
        auVar53 = vfmadd231ps_fma(auVar211,auVar39,auVar52);
        auVar231._8_8_ = auVar54._0_8_;
        auVar231._0_8_ = auVar54._0_8_;
        auVar37 = vshufpd_avx(auVar54,auVar54,3);
        auVar37 = vsubps_avx(auVar37,auVar231);
        auVar39 = vfmadd213ps_fma(auVar37,auVar39,auVar231);
        auVar115._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar115._8_4_ = auVar52._8_4_ ^ 0x80000000;
        auVar115._12_4_ = auVar52._12_4_ ^ 0x80000000;
        auVar37 = vmovshdup_avx(auVar39);
        auVar232._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
        auVar232._8_4_ = auVar37._8_4_ ^ 0x80000000;
        auVar232._12_4_ = auVar37._12_4_ ^ 0x80000000;
        auVar54 = vmovshdup_avx512vl(auVar52);
        auVar55 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar52);
        auVar37 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar37._0_4_ * auVar52._0_4_)),auVar39,auVar54
                                     );
        auVar39 = vpermt2ps_avx512vl(auVar39,SUB6416(ZEXT464(4),0),auVar115);
        auVar122._0_4_ = auVar37._0_4_;
        auVar122._4_4_ = auVar122._0_4_;
        auVar122._8_4_ = auVar122._0_4_;
        auVar122._12_4_ = auVar122._0_4_;
        auVar37 = vdivps_avx(auVar55,auVar122);
        auVar39 = vdivps_avx(auVar39,auVar122);
        fVar183 = auVar53._0_4_;
        auVar52 = vshufps_avx(auVar53,auVar53,0x55);
        fVar201 = auVar39._0_4_;
        auVar212._0_4_ = fVar183 * auVar37._0_4_ + auVar52._0_4_ * fVar201;
        auVar212._4_4_ = fVar183 * auVar37._4_4_ + auVar52._4_4_ * auVar39._4_4_;
        auVar212._8_4_ = fVar183 * auVar37._8_4_ + auVar52._8_4_ * auVar39._8_4_;
        auVar212._12_4_ = fVar183 * auVar37._12_4_ + auVar52._12_4_ * auVar39._12_4_;
        auVar48 = vsubps_avx(auVar43,auVar212);
        auVar53 = vmovshdup_avx(auVar37);
        auVar43 = vinsertps_avx(auVar170,auVar190,0x1c);
        auVar233._0_4_ = auVar53._0_4_ * auVar43._0_4_;
        auVar233._4_4_ = auVar53._4_4_ * auVar43._4_4_;
        auVar233._8_4_ = auVar53._8_4_ * auVar43._8_4_;
        auVar233._12_4_ = auVar53._12_4_ * auVar43._12_4_;
        auVar52 = vinsertps_avx(auVar158,auVar203,0x1c);
        auVar213._0_4_ = auVar53._0_4_ * auVar52._0_4_;
        auVar213._4_4_ = auVar53._4_4_ * auVar52._4_4_;
        auVar213._8_4_ = auVar53._8_4_ * auVar52._8_4_;
        auVar213._12_4_ = auVar53._12_4_ * auVar52._12_4_;
        auVar46 = vminps_avx512vl(auVar233,auVar213);
        auVar55 = vmaxps_avx(auVar213,auVar233);
        auVar51 = vmovshdup_avx(auVar39);
        auVar53 = vinsertps_avx(auVar190,auVar170,0x4c);
        auVar191._0_4_ = auVar51._0_4_ * auVar53._0_4_;
        auVar191._4_4_ = auVar51._4_4_ * auVar53._4_4_;
        auVar191._8_4_ = auVar51._8_4_ * auVar53._8_4_;
        auVar191._12_4_ = auVar51._12_4_ * auVar53._12_4_;
        auVar54 = vinsertps_avx(auVar203,auVar158,0x4c);
        auVar204._0_4_ = auVar51._0_4_ * auVar54._0_4_;
        auVar204._4_4_ = auVar51._4_4_ * auVar54._4_4_;
        auVar204._8_4_ = auVar51._8_4_ * auVar54._8_4_;
        auVar204._12_4_ = auVar51._12_4_ * auVar54._12_4_;
        auVar51 = vminps_avx(auVar191,auVar204);
        auVar46 = vaddps_avx512vl(auVar46,auVar51);
        auVar51 = vmaxps_avx(auVar204,auVar191);
        auVar192._0_4_ = auVar55._0_4_ + auVar51._0_4_;
        auVar192._4_4_ = auVar55._4_4_ + auVar51._4_4_;
        auVar192._8_4_ = auVar55._8_4_ + auVar51._8_4_;
        auVar192._12_4_ = auVar55._12_4_ + auVar51._12_4_;
        auVar205._8_8_ = 0x3f80000000000000;
        auVar205._0_8_ = 0x3f80000000000000;
        auVar55 = vsubps_avx(auVar205,auVar192);
        auVar51 = vsubps_avx(auVar205,auVar46);
        auVar46 = vsubps_avx(auVar57,auVar47);
        auVar47 = vsubps_avx(auVar45,auVar47);
        fVar200 = auVar46._0_4_;
        auVar234._0_4_ = fVar200 * auVar55._0_4_;
        fVar208 = auVar46._4_4_;
        auVar234._4_4_ = fVar208 * auVar55._4_4_;
        fVar216 = auVar46._8_4_;
        auVar234._8_4_ = fVar216 * auVar55._8_4_;
        fVar217 = auVar46._12_4_;
        auVar234._12_4_ = fVar217 * auVar55._12_4_;
        auVar56 = vbroadcastss_avx512vl(auVar37);
        auVar43 = vmulps_avx512vl(auVar56,auVar43);
        auVar52 = vmulps_avx512vl(auVar56,auVar52);
        auVar56 = vminps_avx512vl(auVar43,auVar52);
        auVar43 = vmaxps_avx(auVar52,auVar43);
        auVar171._0_4_ = fVar201 * auVar53._0_4_;
        auVar171._4_4_ = fVar201 * auVar53._4_4_;
        auVar171._8_4_ = fVar201 * auVar53._8_4_;
        auVar171._12_4_ = fVar201 * auVar53._12_4_;
        auVar159._0_4_ = fVar201 * auVar54._0_4_;
        auVar159._4_4_ = fVar201 * auVar54._4_4_;
        auVar159._8_4_ = fVar201 * auVar54._8_4_;
        auVar159._12_4_ = fVar201 * auVar54._12_4_;
        auVar52 = vminps_avx(auVar171,auVar159);
        auVar53 = vaddps_avx512vl(auVar56,auVar52);
        auVar54 = vmulps_avx512vl(auVar46,auVar51);
        fVar183 = auVar47._0_4_;
        auVar193._0_4_ = fVar183 * auVar55._0_4_;
        fVar197 = auVar47._4_4_;
        auVar193._4_4_ = fVar197 * auVar55._4_4_;
        fVar198 = auVar47._8_4_;
        auVar193._8_4_ = fVar198 * auVar55._8_4_;
        fVar199 = auVar47._12_4_;
        auVar193._12_4_ = fVar199 * auVar55._12_4_;
        auVar206._0_4_ = fVar183 * auVar51._0_4_;
        auVar206._4_4_ = fVar197 * auVar51._4_4_;
        auVar206._8_4_ = fVar198 * auVar51._8_4_;
        auVar206._12_4_ = fVar199 * auVar51._12_4_;
        auVar52 = vmaxps_avx(auVar159,auVar171);
        auVar160._0_4_ = auVar43._0_4_ + auVar52._0_4_;
        auVar160._4_4_ = auVar43._4_4_ + auVar52._4_4_;
        auVar160._8_4_ = auVar43._8_4_ + auVar52._8_4_;
        auVar160._12_4_ = auVar43._12_4_ + auVar52._12_4_;
        auVar172._8_8_ = 0x3f800000;
        auVar172._0_8_ = 0x3f800000;
        auVar43 = vsubps_avx(auVar172,auVar160);
        auVar52 = vsubps_avx(auVar172,auVar53);
        auVar224._0_4_ = fVar200 * auVar43._0_4_;
        auVar224._4_4_ = fVar208 * auVar43._4_4_;
        auVar224._8_4_ = fVar216 * auVar43._8_4_;
        auVar224._12_4_ = fVar217 * auVar43._12_4_;
        auVar214._0_4_ = fVar200 * auVar52._0_4_;
        auVar214._4_4_ = fVar208 * auVar52._4_4_;
        auVar214._8_4_ = fVar216 * auVar52._8_4_;
        auVar214._12_4_ = fVar217 * auVar52._12_4_;
        auVar161._0_4_ = fVar183 * auVar43._0_4_;
        auVar161._4_4_ = fVar197 * auVar43._4_4_;
        auVar161._8_4_ = fVar198 * auVar43._8_4_;
        auVar161._12_4_ = fVar199 * auVar43._12_4_;
        auVar173._0_4_ = fVar183 * auVar52._0_4_;
        auVar173._4_4_ = fVar197 * auVar52._4_4_;
        auVar173._8_4_ = fVar198 * auVar52._8_4_;
        auVar173._12_4_ = fVar199 * auVar52._12_4_;
        auVar43 = vminps_avx(auVar224,auVar214);
        auVar52 = vminps_avx(auVar161,auVar173);
        auVar53 = vminps_avx(auVar43,auVar52);
        auVar43 = vmaxps_avx(auVar214,auVar224);
        auVar52 = vmaxps_avx(auVar173,auVar161);
        auVar52 = vmaxps_avx(auVar52,auVar43);
        auVar55 = vminps_avx512vl(auVar234,auVar54);
        auVar43 = vminps_avx(auVar193,auVar206);
        auVar43 = vminps_avx(auVar55,auVar43);
        auVar43 = vhaddps_avx(auVar53,auVar43);
        auVar54 = vmaxps_avx512vl(auVar54,auVar234);
        auVar53 = vmaxps_avx(auVar206,auVar193);
        auVar53 = vmaxps_avx(auVar53,auVar54);
        auVar52 = vhaddps_avx(auVar52,auVar53);
        auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
        auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
        auVar162._0_4_ = auVar43._0_4_ + auVar48._0_4_;
        auVar162._4_4_ = auVar43._4_4_ + auVar48._4_4_;
        auVar162._8_4_ = auVar43._8_4_ + auVar48._8_4_;
        auVar162._12_4_ = auVar43._12_4_ + auVar48._12_4_;
        auVar174._0_4_ = auVar52._0_4_ + auVar48._0_4_;
        auVar174._4_4_ = auVar52._4_4_ + auVar48._4_4_;
        auVar174._8_4_ = auVar52._8_4_ + auVar48._8_4_;
        auVar174._12_4_ = auVar52._12_4_ + auVar48._12_4_;
        auVar43 = vmaxps_avx(auVar57,auVar162);
        auVar52 = vminps_avx(auVar174,auVar45);
        uVar31 = vcmpps_avx512vl(auVar52,auVar43,1);
        auVar43 = vinsertps_avx(auVar49,auVar50,0x10);
        auVar182 = ZEXT1664(auVar43);
        auVar52 = ZEXT416(5);
        if ((uVar31 & 3) == 0) {
          vucomiss_avx512f(auVar36);
          auVar52 = vxorps_avx512vl(auVar52,auVar52);
          auVar242 = ZEXT1664(auVar52);
          if ((uint)uVar24 < 4 && (uVar5 == 0 || lVar28 == 0)) {
            bVar10 = false;
          }
          else {
            lVar28 = 200;
            do {
              auVar45 = vsubss_avx512f(auVar38,auVar48);
              fVar198 = auVar45._0_4_;
              fVar183 = fVar198 * fVar198 * fVar198;
              fVar199 = auVar48._0_4_;
              fVar197 = fVar199 * 3.0 * fVar198 * fVar198;
              fVar198 = fVar198 * fVar199 * fVar199 * 3.0;
              auVar138._4_4_ = fVar183;
              auVar138._0_4_ = fVar183;
              auVar138._8_4_ = fVar183;
              auVar138._12_4_ = fVar183;
              auVar127._4_4_ = fVar197;
              auVar127._0_4_ = fVar197;
              auVar127._8_4_ = fVar197;
              auVar127._12_4_ = fVar197;
              auVar102._4_4_ = fVar198;
              auVar102._0_4_ = fVar198;
              auVar102._8_4_ = fVar198;
              auVar102._12_4_ = fVar198;
              fVar199 = fVar199 * fVar199 * fVar199;
              auVar149._0_4_ = (float)local_328._0_4_ * fVar199;
              auVar149._4_4_ = (float)local_328._4_4_ * fVar199;
              auVar149._8_4_ = fStack_320 * fVar199;
              auVar149._12_4_ = fStack_31c * fVar199;
              auVar45 = vfmadd231ps_fma(auVar149,auVar40,auVar102);
              auVar45 = vfmadd231ps_fma(auVar45,auVar14,auVar127);
              auVar45 = vfmadd231ps_fma(auVar45,auVar34,auVar138);
              auVar103._8_8_ = auVar45._0_8_;
              auVar103._0_8_ = auVar45._0_8_;
              auVar45 = vshufpd_avx(auVar45,auVar45,3);
              auVar53 = vshufps_avx(auVar48,auVar48,0x55);
              auVar45 = vsubps_avx(auVar45,auVar103);
              auVar53 = vfmadd213ps_fma(auVar45,auVar53,auVar103);
              fVar183 = auVar53._0_4_;
              auVar45 = vshufps_avx(auVar53,auVar53,0x55);
              auVar104._0_4_ = auVar37._0_4_ * fVar183 + fVar201 * auVar45._0_4_;
              auVar104._4_4_ = auVar37._4_4_ * fVar183 + auVar39._4_4_ * auVar45._4_4_;
              auVar104._8_4_ = auVar37._8_4_ * fVar183 + auVar39._8_4_ * auVar45._8_4_;
              auVar104._12_4_ = auVar37._12_4_ * fVar183 + auVar39._12_4_ * auVar45._12_4_;
              auVar48 = vsubps_avx(auVar48,auVar104);
              auVar45 = vandps_avx512vl(auVar53,auVar239._0_16_);
              auVar53 = vprolq_avx512vl(auVar45,0x20);
              auVar45 = vmaxss_avx(auVar53,auVar45);
              bVar13 = auVar45._0_4_ <= (float)local_338._0_4_;
              if (auVar45._0_4_ < (float)local_338._0_4_) {
                auVar37 = vucomiss_avx512f(auVar52);
                if (bVar13) {
                  auVar38 = vucomiss_avx512f(auVar37);
                  auVar238 = ZEXT1664(auVar38);
                  if (bVar13) {
                    vmovshdup_avx(auVar37);
                    auVar38 = vucomiss_avx512f(auVar52);
                    if (bVar13) {
                      auVar39 = vucomiss_avx512f(auVar38);
                      auVar238 = ZEXT1664(auVar39);
                      if (bVar13) {
                        auVar45 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar48 = vinsertps_avx(auVar45,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar45 = vdpps_avx(auVar48,local_168,0x7f);
                        auVar53 = vdpps_avx(auVar48,local_178,0x7f);
                        auVar54 = vdpps_avx(auVar48,local_188,0x7f);
                        auVar55 = vdpps_avx(auVar48,local_198,0x7f);
                        auVar51 = vdpps_avx(auVar48,local_1a8,0x7f);
                        auVar46 = vdpps_avx(auVar48,local_1b8,0x7f);
                        auVar47 = vdpps_avx(auVar48,local_1c8,0x7f);
                        auVar48 = vdpps_avx(auVar48,local_1d8,0x7f);
                        auVar57 = vsubss_avx512f(auVar39,auVar38);
                        fVar198 = auVar38._0_4_;
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * auVar51._0_4_)),auVar57,
                                                  auVar45);
                        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar198)),auVar57,
                                                  auVar53);
                        auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar198)),auVar57,
                                                  auVar54);
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * auVar48._0_4_)),auVar57,
                                                  auVar55);
                        auVar39 = vsubss_avx512f(auVar39,auVar37);
                        auVar180._0_4_ = auVar39._0_4_;
                        fVar201 = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                        local_f8 = auVar37._0_4_;
                        fVar183 = local_f8 * 3.0 * auVar180._0_4_ * auVar180._0_4_;
                        fVar197 = auVar180._0_4_ * local_f8 * local_f8 * 3.0;
                        fVar200 = local_f8 * local_f8 * local_f8;
                        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar54._0_4_)),
                                                  ZEXT416((uint)fVar197),auVar53);
                        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar183),auVar45);
                        auVar38 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar201),auVar38);
                        fVar199 = auVar38._0_4_;
                        if ((fVar91 <= fVar199) &&
                           (fVar208 = *(float *)(ray + k * 4 + 0x80), fVar199 <= fVar208)) {
                          local_e8 = vshufps_avx(auVar37,auVar37,0x55);
                          auVar45 = vsubps_avx512vl(auVar142,local_e8);
                          fVar216 = local_e8._0_4_;
                          auVar194._0_4_ = fVar216 * (float)local_1f8._0_4_;
                          fVar217 = local_e8._4_4_;
                          auVar194._4_4_ = fVar217 * (float)local_1f8._4_4_;
                          fVar218 = local_e8._8_4_;
                          auVar194._8_4_ = fVar218 * fStack_1f0;
                          fVar219 = local_e8._12_4_;
                          auVar194._12_4_ = fVar219 * fStack_1ec;
                          auVar207._0_4_ = fVar216 * (float)local_248._0_4_;
                          auVar207._4_4_ = fVar217 * (float)local_248._4_4_;
                          auVar207._8_4_ = fVar218 * fStack_240;
                          auVar207._12_4_ = fVar219 * fStack_23c;
                          auVar215._0_4_ = fVar216 * (float)local_258._0_4_;
                          auVar215._4_4_ = fVar217 * (float)local_258._4_4_;
                          auVar215._8_4_ = fVar218 * fStack_250;
                          auVar215._12_4_ = fVar219 * fStack_24c;
                          auVar225._0_4_ = fVar216 * (float)local_218._0_4_;
                          auVar225._4_4_ = fVar217 * (float)local_218._4_4_;
                          auVar225._8_4_ = fVar218 * fStack_210;
                          auVar225._12_4_ = fVar219 * fStack_20c;
                          auVar37 = vfmadd231ps_fma(auVar194,auVar45,local_1e8);
                          auVar38 = vfmadd231ps_fma(auVar207,auVar45,local_228);
                          auVar39 = vfmadd231ps_fma(auVar215,auVar45,local_238);
                          auVar45 = vfmadd231ps_fma(auVar225,auVar45,local_208);
                          auVar37 = vsubps_avx(auVar38,auVar37);
                          auVar38 = vsubps_avx(auVar39,auVar38);
                          auVar39 = vsubps_avx(auVar45,auVar39);
                          auVar226._0_4_ = local_f8 * auVar38._0_4_;
                          auVar226._4_4_ = local_f8 * auVar38._4_4_;
                          auVar226._8_4_ = local_f8 * auVar38._8_4_;
                          auVar226._12_4_ = local_f8 * auVar38._12_4_;
                          auVar180._4_4_ = auVar180._0_4_;
                          auVar180._8_4_ = auVar180._0_4_;
                          auVar180._12_4_ = auVar180._0_4_;
                          auVar37 = vfmadd231ps_fma(auVar226,auVar180,auVar37);
                          auVar195._0_4_ = local_f8 * auVar39._0_4_;
                          auVar195._4_4_ = local_f8 * auVar39._4_4_;
                          auVar195._8_4_ = local_f8 * auVar39._8_4_;
                          auVar195._12_4_ = local_f8 * auVar39._12_4_;
                          auVar38 = vfmadd231ps_fma(auVar195,auVar180,auVar38);
                          auVar196._0_4_ = local_f8 * auVar38._0_4_;
                          auVar196._4_4_ = local_f8 * auVar38._4_4_;
                          auVar196._8_4_ = local_f8 * auVar38._8_4_;
                          auVar196._12_4_ = local_f8 * auVar38._12_4_;
                          auVar37 = vfmadd231ps_fma(auVar196,auVar180,auVar37);
                          auVar37 = vmulps_avx512vl(auVar37,auVar220);
                          pGVar6 = (context->scene->geometries).items[uVar29].ptr;
                          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                            auVar163._0_4_ = fVar200 * (float)local_298._0_4_;
                            auVar163._4_4_ = fVar200 * (float)local_298._4_4_;
                            auVar163._8_4_ = fVar200 * fStack_290;
                            auVar163._12_4_ = fVar200 * fStack_28c;
                            auVar150._4_4_ = fVar197;
                            auVar150._0_4_ = fVar197;
                            auVar150._8_4_ = fVar197;
                            auVar150._12_4_ = fVar197;
                            auVar38 = vfmadd132ps_fma(auVar150,auVar163,local_288);
                            auVar139._4_4_ = fVar183;
                            auVar139._0_4_ = fVar183;
                            auVar139._8_4_ = fVar183;
                            auVar139._12_4_ = fVar183;
                            auVar38 = vfmadd132ps_fma(auVar139,auVar38,local_278);
                            auVar128._4_4_ = fVar201;
                            auVar128._0_4_ = fVar201;
                            auVar128._8_4_ = fVar201;
                            auVar128._12_4_ = fVar201;
                            auVar45 = vfmadd132ps_fma(auVar128,auVar38,local_268);
                            auVar38 = vshufps_avx(auVar45,auVar45,0xc9);
                            auVar39 = vshufps_avx(auVar37,auVar37,0xc9);
                            auVar129._0_4_ = auVar45._0_4_ * auVar39._0_4_;
                            auVar129._4_4_ = auVar45._4_4_ * auVar39._4_4_;
                            auVar129._8_4_ = auVar45._8_4_ * auVar39._8_4_;
                            auVar129._12_4_ = auVar45._12_4_ * auVar39._12_4_;
                            auVar37 = vfmsub231ps_fma(auVar129,auVar37,auVar38);
                            local_108 = auVar37._0_4_;
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x80) = fVar199;
                              uVar95 = vextractps_avx(auVar37,1);
                              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar95;
                              uVar95 = vextractps_avx(auVar37,2);
                              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar95;
                              *(undefined4 *)(ray + k * 4 + 0xe0) = local_108;
                              *(float *)(ray + k * 4 + 0xf0) = local_f8;
                              *(float *)(ray + k * 4 + 0x100) = fVar198;
                              *(uint *)(ray + k * 4 + 0x110) = uVar4;
                              *(uint *)(ray + k * 4 + 0x120) = uVar29;
                              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            }
                            else {
                              auVar38 = vshufps_avx(auVar37,auVar37,0x55);
                              local_118 = vshufps_avx(auVar37,auVar37,0xaa);
                              local_128[0] = (RTCHitN)auVar38[0];
                              local_128[1] = (RTCHitN)auVar38[1];
                              local_128[2] = (RTCHitN)auVar38[2];
                              local_128[3] = (RTCHitN)auVar38[3];
                              local_128[4] = (RTCHitN)auVar38[4];
                              local_128[5] = (RTCHitN)auVar38[5];
                              local_128[6] = (RTCHitN)auVar38[6];
                              local_128[7] = (RTCHitN)auVar38[7];
                              local_128[8] = (RTCHitN)auVar38[8];
                              local_128[9] = (RTCHitN)auVar38[9];
                              local_128[10] = (RTCHitN)auVar38[10];
                              local_128[0xb] = (RTCHitN)auVar38[0xb];
                              local_128[0xc] = (RTCHitN)auVar38[0xc];
                              local_128[0xd] = (RTCHitN)auVar38[0xd];
                              local_128[0xe] = (RTCHitN)auVar38[0xe];
                              local_128[0xf] = (RTCHitN)auVar38[0xf];
                              uStack_104 = local_108;
                              uStack_100 = local_108;
                              uStack_fc = local_108;
                              fStack_f4 = local_f8;
                              fStack_f0 = local_f8;
                              fStack_ec = local_f8;
                              local_d8 = local_2c8._0_8_;
                              uStack_d0 = local_2c8._8_8_;
                              local_c8 = local_2b8;
                              vpcmpeqd_avx2(ZEXT1632(local_2b8),ZEXT1632(local_2b8));
                              uStack_b4 = context->user->instID[0];
                              local_b8 = uStack_b4;
                              uStack_b0 = uStack_b4;
                              uStack_ac = uStack_b4;
                              uStack_a8 = context->user->instPrimID[0];
                              uStack_a4 = uStack_a8;
                              uStack_a0 = uStack_a8;
                              uStack_9c = uStack_a8;
                              *(float *)(ray + k * 4 + 0x80) = fVar199;
                              local_388 = local_2d8._0_8_;
                              uStack_380 = local_2d8._8_8_;
                              local_368.valid = (int *)&local_388;
                              local_368.geometryUserPtr = pGVar6->userPtr;
                              local_368.context = context->user;
                              local_368.hit = local_128;
                              local_368.N = 4;
                              local_368.ray = (RTCRayN *)ray;
                              if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                local_370 = context;
                                (*pGVar6->intersectionFilterN)(&local_368);
                                auVar37 = vxorps_avx512vl(auVar52,auVar52);
                                auVar242 = ZEXT1664(auVar37);
                                auVar238 = ZEXT464(0x3f800000);
                                auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM19 = ZEXT3264(auVar71);
                                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar237 = ZEXT1664(auVar37);
                                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar239 = ZEXT1664(auVar37);
                                context = local_370;
                              }
                              auVar37 = auVar242._0_16_;
                              auVar20._8_8_ = uStack_380;
                              auVar20._0_8_ = local_388;
                              uVar31 = vptestmd_avx512vl(auVar20,auVar20);
                              if ((uVar31 & 0xf) == 0) {
LAB_01b3c9e2:
                                *(float *)(ray + k * 4 + 0x80) = fVar208;
                              }
                              else {
                                p_Var9 = context->args->filter;
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var9)(&local_368);
                                  auVar37 = vxorps_avx512vl(auVar37,auVar37);
                                  auVar242 = ZEXT1664(auVar37);
                                  auVar238 = ZEXT464(0x3f800000);
                                  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM19 = ZEXT3264(auVar71);
                                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar237 = ZEXT1664(auVar37);
                                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar239 = ZEXT1664(auVar37);
                                }
                                auVar21._8_8_ = uStack_380;
                                auVar21._0_8_ = local_388;
                                uVar31 = vptestmd_avx512vl(auVar21,auVar21);
                                uVar31 = uVar31 & 0xf;
                                bVar22 = (byte)uVar31;
                                if (bVar22 == 0) goto LAB_01b3c9e2;
                                iVar90 = *(int *)(local_368.hit + 4);
                                iVar241 = *(int *)(local_368.hit + 8);
                                iVar19 = *(int *)(local_368.hit + 0xc);
                                bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                                bVar12 = SUB81(uVar31 >> 3,0);
                                *(uint *)(local_368.ray + 0xc0) =
                                     (uint)(bVar22 & 1) * *(int *)local_368.hit |
                                     (uint)!(bool)(bVar22 & 1) * *(int *)(local_368.ray + 0xc0);
                                *(uint *)(local_368.ray + 0xc4) =
                                     (uint)bVar13 * iVar90 |
                                     (uint)!bVar13 * *(int *)(local_368.ray + 0xc4);
                                *(uint *)(local_368.ray + 200) =
                                     (uint)bVar11 * iVar241 |
                                     (uint)!bVar11 * *(int *)(local_368.ray + 200);
                                *(uint *)(local_368.ray + 0xcc) =
                                     (uint)bVar12 * iVar19 |
                                     (uint)!bVar12 * *(int *)(local_368.ray + 0xcc);
                                iVar90 = *(int *)(local_368.hit + 0x14);
                                iVar241 = *(int *)(local_368.hit + 0x18);
                                iVar19 = *(int *)(local_368.hit + 0x1c);
                                bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                                bVar12 = SUB81(uVar31 >> 3,0);
                                *(uint *)(local_368.ray + 0xd0) =
                                     (uint)(bVar22 & 1) * *(int *)(local_368.hit + 0x10) |
                                     (uint)!(bool)(bVar22 & 1) * *(int *)(local_368.ray + 0xd0);
                                *(uint *)(local_368.ray + 0xd4) =
                                     (uint)bVar13 * iVar90 |
                                     (uint)!bVar13 * *(int *)(local_368.ray + 0xd4);
                                *(uint *)(local_368.ray + 0xd8) =
                                     (uint)bVar11 * iVar241 |
                                     (uint)!bVar11 * *(int *)(local_368.ray + 0xd8);
                                *(uint *)(local_368.ray + 0xdc) =
                                     (uint)bVar12 * iVar19 |
                                     (uint)!bVar12 * *(int *)(local_368.ray + 0xdc);
                                iVar90 = *(int *)(local_368.hit + 0x24);
                                iVar241 = *(int *)(local_368.hit + 0x28);
                                iVar19 = *(int *)(local_368.hit + 0x2c);
                                bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                                bVar12 = SUB81(uVar31 >> 3,0);
                                *(uint *)(local_368.ray + 0xe0) =
                                     (uint)(bVar22 & 1) * *(int *)(local_368.hit + 0x20) |
                                     (uint)!(bool)(bVar22 & 1) * *(int *)(local_368.ray + 0xe0);
                                *(uint *)(local_368.ray + 0xe4) =
                                     (uint)bVar13 * iVar90 |
                                     (uint)!bVar13 * *(int *)(local_368.ray + 0xe4);
                                *(uint *)(local_368.ray + 0xe8) =
                                     (uint)bVar11 * iVar241 |
                                     (uint)!bVar11 * *(int *)(local_368.ray + 0xe8);
                                *(uint *)(local_368.ray + 0xec) =
                                     (uint)bVar12 * iVar19 |
                                     (uint)!bVar12 * *(int *)(local_368.ray + 0xec);
                                iVar90 = *(int *)(local_368.hit + 0x34);
                                iVar241 = *(int *)(local_368.hit + 0x38);
                                iVar19 = *(int *)(local_368.hit + 0x3c);
                                bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                                bVar12 = SUB81(uVar31 >> 3,0);
                                *(uint *)(local_368.ray + 0xf0) =
                                     (uint)(bVar22 & 1) * *(int *)(local_368.hit + 0x30) |
                                     (uint)!(bool)(bVar22 & 1) * *(int *)(local_368.ray + 0xf0);
                                *(uint *)(local_368.ray + 0xf4) =
                                     (uint)bVar13 * iVar90 |
                                     (uint)!bVar13 * *(int *)(local_368.ray + 0xf4);
                                *(uint *)(local_368.ray + 0xf8) =
                                     (uint)bVar11 * iVar241 |
                                     (uint)!bVar11 * *(int *)(local_368.ray + 0xf8);
                                *(uint *)(local_368.ray + 0xfc) =
                                     (uint)bVar12 * iVar19 |
                                     (uint)!bVar12 * *(int *)(local_368.ray + 0xfc);
                                iVar90 = *(int *)(local_368.hit + 0x44);
                                iVar241 = *(int *)(local_368.hit + 0x48);
                                iVar19 = *(int *)(local_368.hit + 0x4c);
                                bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                                bVar12 = SUB81(uVar31 >> 3,0);
                                *(uint *)(local_368.ray + 0x100) =
                                     (uint)(bVar22 & 1) * *(int *)(local_368.hit + 0x40) |
                                     (uint)!(bool)(bVar22 & 1) * *(int *)(local_368.ray + 0x100);
                                *(uint *)(local_368.ray + 0x104) =
                                     (uint)bVar13 * iVar90 |
                                     (uint)!bVar13 * *(int *)(local_368.ray + 0x104);
                                *(uint *)(local_368.ray + 0x108) =
                                     (uint)bVar11 * iVar241 |
                                     (uint)!bVar11 * *(int *)(local_368.ray + 0x108);
                                *(uint *)(local_368.ray + 0x10c) =
                                     (uint)bVar12 * iVar19 |
                                     (uint)!bVar12 * *(int *)(local_368.ray + 0x10c);
                                auVar37 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_368.hit + 0x50));
                                *(undefined1 (*) [16])(local_368.ray + 0x110) = auVar37;
                                auVar37 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_368.hit + 0x60));
                                *(undefined1 (*) [16])(local_368.ray + 0x120) = auVar37;
                                auVar37 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_368.hit + 0x70));
                                *(undefined1 (*) [16])(local_368.ray + 0x130) = auVar37;
                                auVar37 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_368.hit + 0x80));
                                *(undefined1 (*) [16])(local_368.ray + 0x140) = auVar37;
                              }
                              auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar240 = ZEXT1664(auVar37);
                              auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar236 = ZEXT1664(auVar37);
                            }
                            auVar182 = ZEXT1664(auVar43);
                            goto LAB_01b3c5b4;
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar28 = lVar28 + -1;
            } while (lVar28 != 0);
          }
          auVar182 = ZEXT1664(auVar43);
        }
        else {
          auVar37 = vxorps_avx512vl(ZEXT416(5),auVar52);
          auVar242 = ZEXT1664(auVar37);
        }
      }
LAB_01b3c5b4:
    } while (bVar10);
    auVar33 = vinsertps_avx512f(auVar36,auVar33,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }